

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<8,4>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx512::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Primitive PVar14;
  uint uVar15;
  undefined4 uVar16;
  RTCFilterFunctionN p_Var17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  int iVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  undefined1 auVar76 [32];
  byte bVar77;
  ulong uVar78;
  uint uVar79;
  uint uVar80;
  long lVar81;
  Geometry *pGVar82;
  int iVar83;
  ulong uVar84;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  uint uVar85;
  ulong uVar86;
  byte bVar87;
  ulong uVar88;
  float fVar89;
  float fVar90;
  float fVar141;
  float fVar142;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar98 [16];
  float fVar143;
  float fVar145;
  float fVar146;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar144;
  float fVar147;
  float fVar148;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  float fVar149;
  undefined4 uVar150;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar162;
  float fVar163;
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar166;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  float fVar174;
  float fVar175;
  float fVar186;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [64];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [64];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [64];
  undefined1 auVar202 [16];
  undefined1 auVar203 [64];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  RTCFilterFunctionNArguments args;
  float local_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  RTCFilterFunctionNArguments local_5a0;
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  ulong local_548;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [32];
  undefined8 local_4c0;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined4 local_420;
  undefined4 uStack_41c;
  undefined4 uStack_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  int local_3f0;
  int iStack_3ec;
  int iStack_3e8;
  int iStack_3e4;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  undefined4 local_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined1 local_390 [16];
  uint local_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint uStack_368;
  uint uStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined4 local_200;
  int local_1fc;
  undefined1 local_1f0 [16];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar217 [64];
  
  PVar14 = prim[1];
  uVar84 = (ulong)(byte)PVar14;
  fVar166 = *(float *)(prim + uVar84 * 0x19 + 0x12);
  auVar96 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar96 = vinsertps_avx(auVar96,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar97 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar153 = vinsertps_avx(auVar97,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar94 = vsubps_avx(auVar96,*(undefined1 (*) [16])(prim + uVar84 * 0x19 + 6));
  fVar174 = fVar166 * auVar94._0_4_;
  fVar149 = fVar166 * auVar153._0_4_;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar84 * 4 + 6);
  auVar104 = vpmovsxbd_avx2(auVar96);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + uVar84 * 5 + 6);
  auVar102 = vpmovsxbd_avx2(auVar97);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar84 * 6 + 6);
  auVar115 = vpmovsxbd_avx2(auVar8);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar84 * 0xb + 6);
  auVar114 = vpmovsxbd_avx2(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar14 * 0xc) + 6);
  auVar108 = vpmovsxbd_avx2(auVar10);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar105 = vcvtdq2ps_avx(auVar108);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (uint)(byte)PVar14 * 0xc + uVar84 + 6);
  auVar103 = vpmovsxbd_avx2(auVar11);
  auVar103 = vcvtdq2ps_avx(auVar103);
  uVar86 = (ulong)(uint)((int)(uVar84 * 9) * 2);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar86 + 6);
  auVar106 = vpmovsxbd_avx2(auVar12);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar86 + uVar84 + 6);
  auVar113 = vpmovsxbd_avx2(auVar13);
  auVar113 = vcvtdq2ps_avx(auVar113);
  uVar78 = (ulong)(uint)((int)(uVar84 * 5) << 2);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar78 + 6);
  auVar101 = vpmovsxbd_avx2(auVar95);
  auVar107 = vcvtdq2ps_avx(auVar101);
  auVar210._4_4_ = fVar149;
  auVar210._0_4_ = fVar149;
  auVar210._8_4_ = fVar149;
  auVar210._12_4_ = fVar149;
  auVar210._16_4_ = fVar149;
  auVar210._20_4_ = fVar149;
  auVar210._24_4_ = fVar149;
  auVar210._28_4_ = fVar149;
  auVar212._8_4_ = 1;
  auVar212._0_8_ = 0x100000001;
  auVar212._12_4_ = 1;
  auVar212._16_4_ = 1;
  auVar212._20_4_ = 1;
  auVar212._24_4_ = 1;
  auVar212._28_4_ = 1;
  auVar99 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar110 = ZEXT1632(CONCAT412(fVar166 * auVar153._12_4_,
                                CONCAT48(fVar166 * auVar153._8_4_,
                                         CONCAT44(fVar166 * auVar153._4_4_,fVar149))));
  auVar109 = vpermps_avx2(auVar212,auVar110);
  auVar100 = vpermps_avx512vl(auVar99,auVar110);
  fVar149 = auVar100._0_4_;
  fVar162 = auVar100._4_4_;
  auVar110._4_4_ = fVar162 * auVar115._4_4_;
  auVar110._0_4_ = fVar149 * auVar115._0_4_;
  fVar163 = auVar100._8_4_;
  auVar110._8_4_ = fVar163 * auVar115._8_4_;
  fVar175 = auVar100._12_4_;
  auVar110._12_4_ = fVar175 * auVar115._12_4_;
  fVar186 = auVar100._16_4_;
  auVar110._16_4_ = fVar186 * auVar115._16_4_;
  fVar89 = auVar100._20_4_;
  auVar110._20_4_ = fVar89 * auVar115._20_4_;
  fVar90 = auVar100._24_4_;
  auVar110._24_4_ = fVar90 * auVar115._24_4_;
  auVar110._28_4_ = auVar108._28_4_;
  auVar108._4_4_ = auVar103._4_4_ * fVar162;
  auVar108._0_4_ = auVar103._0_4_ * fVar149;
  auVar108._8_4_ = auVar103._8_4_ * fVar163;
  auVar108._12_4_ = auVar103._12_4_ * fVar175;
  auVar108._16_4_ = auVar103._16_4_ * fVar186;
  auVar108._20_4_ = auVar103._20_4_ * fVar89;
  auVar108._24_4_ = auVar103._24_4_ * fVar90;
  auVar108._28_4_ = auVar101._28_4_;
  auVar101._4_4_ = auVar107._4_4_ * fVar162;
  auVar101._0_4_ = auVar107._0_4_ * fVar149;
  auVar101._8_4_ = auVar107._8_4_ * fVar163;
  auVar101._12_4_ = auVar107._12_4_ * fVar175;
  auVar101._16_4_ = auVar107._16_4_ * fVar186;
  auVar101._20_4_ = auVar107._20_4_ * fVar89;
  auVar101._24_4_ = auVar107._24_4_ * fVar90;
  auVar101._28_4_ = auVar100._28_4_;
  auVar96 = vfmadd231ps_fma(auVar110,auVar109,auVar102);
  auVar97 = vfmadd231ps_fma(auVar108,auVar109,auVar105);
  auVar8 = vfmadd231ps_fma(auVar101,auVar113,auVar109);
  auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar210,auVar104);
  auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar210,auVar114);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar106,auVar210);
  auVar211._4_4_ = fVar174;
  auVar211._0_4_ = fVar174;
  auVar211._8_4_ = fVar174;
  auVar211._12_4_ = fVar174;
  auVar211._16_4_ = fVar174;
  auVar211._20_4_ = fVar174;
  auVar211._24_4_ = fVar174;
  auVar211._28_4_ = fVar174;
  auVar101 = ZEXT1632(CONCAT412(fVar166 * auVar94._12_4_,
                                CONCAT48(fVar166 * auVar94._8_4_,
                                         CONCAT44(fVar166 * auVar94._4_4_,fVar174))));
  auVar108 = vpermps_avx2(auVar212,auVar101);
  auVar101 = vpermps_avx512vl(auVar99,auVar101);
  fVar166 = auVar101._0_4_;
  fVar149 = auVar101._4_4_;
  auVar109._4_4_ = fVar149 * auVar115._4_4_;
  auVar109._0_4_ = fVar166 * auVar115._0_4_;
  fVar162 = auVar101._8_4_;
  auVar109._8_4_ = fVar162 * auVar115._8_4_;
  fVar163 = auVar101._12_4_;
  auVar109._12_4_ = fVar163 * auVar115._12_4_;
  fVar175 = auVar101._16_4_;
  auVar109._16_4_ = fVar175 * auVar115._16_4_;
  fVar186 = auVar101._20_4_;
  auVar109._20_4_ = fVar186 * auVar115._20_4_;
  fVar89 = auVar101._24_4_;
  auVar109._24_4_ = fVar89 * auVar115._24_4_;
  auVar109._28_4_ = 1;
  auVar99._4_4_ = auVar103._4_4_ * fVar149;
  auVar99._0_4_ = auVar103._0_4_ * fVar166;
  auVar99._8_4_ = auVar103._8_4_ * fVar162;
  auVar99._12_4_ = auVar103._12_4_ * fVar163;
  auVar99._16_4_ = auVar103._16_4_ * fVar175;
  auVar99._20_4_ = auVar103._20_4_ * fVar186;
  auVar99._24_4_ = auVar103._24_4_ * fVar89;
  auVar99._28_4_ = auVar115._28_4_;
  auVar103._4_4_ = auVar107._4_4_ * fVar149;
  auVar103._0_4_ = auVar107._0_4_ * fVar166;
  auVar103._8_4_ = auVar107._8_4_ * fVar162;
  auVar103._12_4_ = auVar107._12_4_ * fVar163;
  auVar103._16_4_ = auVar107._16_4_ * fVar175;
  auVar103._20_4_ = auVar107._20_4_ * fVar186;
  auVar103._24_4_ = auVar107._24_4_ * fVar89;
  auVar103._28_4_ = auVar101._28_4_;
  auVar9 = vfmadd231ps_fma(auVar109,auVar108,auVar102);
  auVar10 = vfmadd231ps_fma(auVar99,auVar108,auVar105);
  auVar11 = vfmadd231ps_fma(auVar103,auVar108,auVar113);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar211,auVar104);
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar211,auVar114);
  auVar200._8_4_ = 0x7fffffff;
  auVar200._0_8_ = 0x7fffffff7fffffff;
  auVar200._12_4_ = 0x7fffffff;
  auVar200._16_4_ = 0x7fffffff;
  auVar200._20_4_ = 0x7fffffff;
  auVar200._24_4_ = 0x7fffffff;
  auVar200._28_4_ = 0x7fffffff;
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar211,auVar106);
  auVar104 = vandps_avx(ZEXT1632(auVar96),auVar200);
  auVar198._8_4_ = 0x219392ef;
  auVar198._0_8_ = 0x219392ef219392ef;
  auVar198._12_4_ = 0x219392ef;
  auVar198._16_4_ = 0x219392ef;
  auVar198._20_4_ = 0x219392ef;
  auVar198._24_4_ = 0x219392ef;
  auVar198._28_4_ = 0x219392ef;
  uVar86 = vcmpps_avx512vl(auVar104,auVar198,1);
  bVar18 = (bool)((byte)uVar86 & 1);
  auVar100._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar96._0_4_;
  bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar96._4_4_;
  bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar96._8_4_;
  bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar96._12_4_;
  auVar100._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * 0x219392ef;
  auVar100._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * 0x219392ef;
  auVar100._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * 0x219392ef;
  auVar100._28_4_ = (uint)(byte)(uVar86 >> 7) * 0x219392ef;
  auVar104 = vandps_avx(ZEXT1632(auVar97),auVar200);
  uVar86 = vcmpps_avx512vl(auVar104,auVar198,1);
  bVar18 = (bool)((byte)uVar86 & 1);
  auVar111._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar97._0_4_;
  bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
  auVar111._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar97._4_4_;
  bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
  auVar111._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar97._8_4_;
  bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
  auVar111._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar97._12_4_;
  auVar111._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * 0x219392ef;
  auVar111._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * 0x219392ef;
  auVar111._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * 0x219392ef;
  auVar111._28_4_ = (uint)(byte)(uVar86 >> 7) * 0x219392ef;
  auVar104 = vandps_avx(ZEXT1632(auVar8),auVar200);
  uVar86 = vcmpps_avx512vl(auVar104,auVar198,1);
  bVar18 = (bool)((byte)uVar86 & 1);
  auVar104._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar8._0_4_;
  bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
  auVar104._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar8._4_4_;
  bVar18 = (bool)((byte)(uVar86 >> 2) & 1);
  auVar104._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar8._8_4_;
  bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
  auVar104._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar8._12_4_;
  auVar104._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * 0x219392ef;
  auVar104._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * 0x219392ef;
  auVar104._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * 0x219392ef;
  auVar104._28_4_ = (uint)(byte)(uVar86 >> 7) * 0x219392ef;
  auVar102 = vrcp14ps_avx512vl(auVar100);
  auVar199._8_4_ = 0x3f800000;
  auVar199._0_8_ = 0x3f8000003f800000;
  auVar199._12_4_ = 0x3f800000;
  auVar199._16_4_ = 0x3f800000;
  auVar199._20_4_ = 0x3f800000;
  auVar199._24_4_ = 0x3f800000;
  auVar199._28_4_ = 0x3f800000;
  auVar96 = vfnmadd213ps_fma(auVar100,auVar102,auVar199);
  auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar102,auVar102);
  auVar102 = vrcp14ps_avx512vl(auVar111);
  auVar97 = vfnmadd213ps_fma(auVar111,auVar102,auVar199);
  auVar97 = vfmadd132ps_fma(ZEXT1632(auVar97),auVar102,auVar102);
  auVar102 = vrcp14ps_avx512vl(auVar104);
  auVar8 = vfnmadd213ps_fma(auVar104,auVar102,auVar199);
  auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar102,auVar102);
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar84 * 7 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar9));
  auVar106._4_4_ = auVar96._4_4_ * auVar104._4_4_;
  auVar106._0_4_ = auVar96._0_4_ * auVar104._0_4_;
  auVar106._8_4_ = auVar96._8_4_ * auVar104._8_4_;
  auVar106._12_4_ = auVar96._12_4_ * auVar104._12_4_;
  auVar106._16_4_ = auVar104._16_4_ * 0.0;
  auVar106._20_4_ = auVar104._20_4_ * 0.0;
  auVar106._24_4_ = auVar104._24_4_ * 0.0;
  auVar106._28_4_ = auVar104._28_4_;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar84 * 9 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar9));
  auVar103 = vpbroadcastd_avx512vl();
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar14 * 0x10 + 6));
  auVar171._0_4_ = auVar96._0_4_ * auVar104._0_4_;
  auVar171._4_4_ = auVar96._4_4_ * auVar104._4_4_;
  auVar171._8_4_ = auVar96._8_4_ * auVar104._8_4_;
  auVar171._12_4_ = auVar96._12_4_ * auVar104._12_4_;
  auVar171._16_4_ = auVar104._16_4_ * 0.0;
  auVar171._20_4_ = auVar104._20_4_ * 0.0;
  auVar171._24_4_ = auVar104._24_4_ * 0.0;
  auVar171._28_4_ = 0;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar14 * 0x10 + uVar84 * -2 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar10));
  auVar113._4_4_ = auVar97._4_4_ * auVar104._4_4_;
  auVar113._0_4_ = auVar97._0_4_ * auVar104._0_4_;
  auVar113._8_4_ = auVar97._8_4_ * auVar104._8_4_;
  auVar113._12_4_ = auVar97._12_4_ * auVar104._12_4_;
  auVar113._16_4_ = auVar104._16_4_ * 0.0;
  auVar113._20_4_ = auVar104._20_4_ * 0.0;
  auVar113._24_4_ = auVar104._24_4_ * 0.0;
  auVar113._28_4_ = auVar104._28_4_;
  auVar104 = vcvtdq2ps_avx(auVar102);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar10));
  auVar164._0_4_ = auVar97._0_4_ * auVar104._0_4_;
  auVar164._4_4_ = auVar97._4_4_ * auVar104._4_4_;
  auVar164._8_4_ = auVar97._8_4_ * auVar104._8_4_;
  auVar164._12_4_ = auVar97._12_4_ * auVar104._12_4_;
  auVar164._16_4_ = auVar104._16_4_ * 0.0;
  auVar164._20_4_ = auVar104._20_4_ * 0.0;
  auVar164._24_4_ = auVar104._24_4_ * 0.0;
  auVar164._28_4_ = 0;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 + uVar84 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar11));
  auVar107._4_4_ = auVar104._4_4_ * auVar8._4_4_;
  auVar107._0_4_ = auVar104._0_4_ * auVar8._0_4_;
  auVar107._8_4_ = auVar104._8_4_ * auVar8._8_4_;
  auVar107._12_4_ = auVar104._12_4_ * auVar8._12_4_;
  auVar107._16_4_ = auVar104._16_4_ * 0.0;
  auVar107._20_4_ = auVar104._20_4_ * 0.0;
  auVar107._24_4_ = auVar104._24_4_ * 0.0;
  auVar107._28_4_ = auVar104._28_4_;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar84 * 0x17 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar11));
  auVar112._0_4_ = auVar8._0_4_ * auVar104._0_4_;
  auVar112._4_4_ = auVar8._4_4_ * auVar104._4_4_;
  auVar112._8_4_ = auVar8._8_4_ * auVar104._8_4_;
  auVar112._12_4_ = auVar8._12_4_ * auVar104._12_4_;
  auVar112._16_4_ = auVar104._16_4_ * 0.0;
  auVar112._20_4_ = auVar104._20_4_ * 0.0;
  auVar112._24_4_ = auVar104._24_4_ * 0.0;
  auVar112._28_4_ = 0;
  auVar104 = vpminsd_avx2(auVar106,auVar171);
  auVar102 = vpminsd_avx2(auVar113,auVar164);
  auVar104 = vmaxps_avx(auVar104,auVar102);
  auVar102 = vpminsd_avx2(auVar107,auVar112);
  uVar150 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar115._4_4_ = uVar150;
  auVar115._0_4_ = uVar150;
  auVar115._8_4_ = uVar150;
  auVar115._12_4_ = uVar150;
  auVar115._16_4_ = uVar150;
  auVar115._20_4_ = uVar150;
  auVar115._24_4_ = uVar150;
  auVar115._28_4_ = uVar150;
  auVar102 = vmaxps_avx512vl(auVar102,auVar115);
  auVar104 = vmaxps_avx(auVar104,auVar102);
  auVar102._8_4_ = 0x3f7ffffa;
  auVar102._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar102._12_4_ = 0x3f7ffffa;
  auVar102._16_4_ = 0x3f7ffffa;
  auVar102._20_4_ = 0x3f7ffffa;
  auVar102._24_4_ = 0x3f7ffffa;
  auVar102._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar104,auVar102);
  auVar104 = vpmaxsd_avx2(auVar106,auVar171);
  auVar102 = vpmaxsd_avx2(auVar113,auVar164);
  auVar104 = vminps_avx(auVar104,auVar102);
  auVar102 = vpmaxsd_avx2(auVar107,auVar112);
  uVar150 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar114._4_4_ = uVar150;
  auVar114._0_4_ = uVar150;
  auVar114._8_4_ = uVar150;
  auVar114._12_4_ = uVar150;
  auVar114._16_4_ = uVar150;
  auVar114._20_4_ = uVar150;
  auVar114._24_4_ = uVar150;
  auVar114._28_4_ = uVar150;
  auVar102 = vminps_avx512vl(auVar102,auVar114);
  auVar104 = vminps_avx(auVar104,auVar102);
  auVar105._8_4_ = 0x3f800003;
  auVar105._0_8_ = 0x3f8000033f800003;
  auVar105._12_4_ = 0x3f800003;
  auVar105._16_4_ = 0x3f800003;
  auVar105._20_4_ = 0x3f800003;
  auVar105._24_4_ = 0x3f800003;
  auVar105._28_4_ = 0x3f800003;
  auVar104 = vmulps_avx512vl(auVar104,auVar105);
  uVar27 = vpcmpgtd_avx512vl(auVar103,_DAT_01fe9900);
  uVar24 = vcmpps_avx512vl(local_80,auVar104,2);
  if ((byte)((byte)uVar24 & (byte)uVar27) != 0) {
    uVar86 = (ulong)(byte)((byte)uVar24 & (byte)uVar27);
    local_4f0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      lVar28 = 0;
      for (uVar78 = uVar86; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
        lVar28 = lVar28 + 1;
      }
      uVar85 = *(uint *)(prim + 2);
      uVar15 = *(uint *)(prim + lVar28 * 4 + 6);
      pGVar82 = (context->scene->geometries).items[uVar85].ptr;
      uVar78 = (ulong)*(uint *)(*(long *)&pGVar82->field_0x58 +
                               pGVar82[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * (ulong)uVar15);
      p_Var17 = pGVar82[1].intersectionFilterN;
      lVar28 = *(long *)&pGVar82[1].time_range.upper;
      local_5b0 = *(undefined1 (*) [16])(lVar28 + (long)p_Var17 * uVar78);
      pauVar3 = (undefined1 (*) [16])(lVar28 + (uVar78 + 1) * (long)p_Var17);
      uVar24 = *(undefined8 *)*pauVar3;
      uVar27 = *(undefined8 *)(*pauVar3 + 8);
      auVar13 = *pauVar3;
      auVar11 = *pauVar3;
      auVar9 = *pauVar3;
      auVar96 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar28 + (uVar78 + 2) * (long)p_Var17);
      uVar72 = *(undefined8 *)*pauVar4;
      uVar73 = *(undefined8 *)(*pauVar4 + 8);
      auVar12 = *pauVar4;
      auVar10 = *pauVar4;
      auVar8 = *pauVar4;
      auVar97 = *pauVar4;
      uVar86 = uVar86 - 1 & uVar86;
      pauVar5 = (undefined1 (*) [12])(lVar28 + (uVar78 + 3) * (long)p_Var17);
      uVar74 = *(undefined8 *)*pauVar5;
      uVar75 = *(undefined8 *)(*pauVar5 + 8);
      local_5f0 = (float)uVar74;
      fStack_5ec = (float)((ulong)uVar74 >> 0x20);
      fStack_5e8 = (float)uVar75;
      fStack_5e4 = (float)((ulong)uVar75 >> 0x20);
      if (uVar86 != 0) {
        uVar84 = uVar86 - 1 & uVar86;
        for (uVar78 = uVar86; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
        }
        if (uVar84 != 0) {
          for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar83 = (int)pGVar82[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar95 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      auVar95 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar94 = vsubps_avx(local_5b0,auVar95);
      uVar150 = auVar94._0_4_;
      auVar91._4_4_ = uVar150;
      auVar91._0_4_ = uVar150;
      auVar91._8_4_ = uVar150;
      auVar91._12_4_ = uVar150;
      auVar153 = vshufps_avx(auVar94,auVar94,0x55);
      auVar94 = vshufps_avx(auVar94,auVar94,0xaa);
      aVar6 = pre->ray_space[k].vx.field_0;
      aVar7 = pre->ray_space[k].vy.field_0;
      fVar166 = pre->ray_space[k].vz.field_0.m128[0];
      fVar149 = pre->ray_space[k].vz.field_0.m128[1];
      fVar162 = pre->ray_space[k].vz.field_0.m128[2];
      fVar163 = pre->ray_space[k].vz.field_0.m128[3];
      auVar202._0_4_ = fVar166 * auVar94._0_4_;
      auVar202._4_4_ = fVar149 * auVar94._4_4_;
      auVar202._8_4_ = fVar162 * auVar94._8_4_;
      auVar202._12_4_ = fVar163 * auVar94._12_4_;
      auVar153 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar7,auVar153);
      auVar202 = vfmadd231ps_fma(auVar153,(undefined1  [16])aVar6,auVar91);
      auVar153 = vshufps_avx(local_5b0,local_5b0,0xff);
      auVar91 = vsubps_avx512vl(auVar96,auVar95);
      uVar150 = auVar91._0_4_;
      auVar176._4_4_ = uVar150;
      auVar176._0_4_ = uVar150;
      auVar176._8_4_ = uVar150;
      auVar176._12_4_ = uVar150;
      auVar94 = vshufps_avx(auVar91,auVar91,0x55);
      auVar91 = vshufps_avx(auVar91,auVar91,0xaa);
      auVar92._0_4_ = fVar166 * auVar91._0_4_;
      auVar92._4_4_ = fVar149 * auVar91._4_4_;
      auVar92._8_4_ = fVar162 * auVar91._8_4_;
      auVar92._12_4_ = fVar163 * auVar91._12_4_;
      auVar94 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar7,auVar94);
      auVar176 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar6,auVar176);
      auVar92 = vshufps_avx512vl(auVar96,auVar96,0xff);
      auVar91 = vsubps_avx512vl(auVar97,auVar95);
      uVar150 = auVar91._0_4_;
      auVar93._4_4_ = uVar150;
      auVar93._0_4_ = uVar150;
      auVar93._8_4_ = uVar150;
      auVar93._12_4_ = uVar150;
      auVar94 = vshufps_avx(auVar91,auVar91,0x55);
      auVar91 = vshufps_avx(auVar91,auVar91,0xaa);
      auVar206._0_4_ = fVar166 * auVar91._0_4_;
      auVar206._4_4_ = fVar149 * auVar91._4_4_;
      auVar206._8_4_ = fVar162 * auVar91._8_4_;
      auVar206._12_4_ = fVar163 * auVar91._12_4_;
      auVar94 = vfmadd231ps_fma(auVar206,(undefined1  [16])aVar7,auVar94);
      auVar91 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar6,auVar93);
      auVar93 = vshufps_avx512vl(auVar97,auVar97,0xff);
      auVar29._12_4_ = fStack_5e4;
      auVar29._0_12_ = *pauVar5;
      auVar94 = vsubps_avx512vl(auVar29,auVar95);
      uVar150 = auVar94._0_4_;
      auVar177._4_4_ = uVar150;
      auVar177._0_4_ = uVar150;
      auVar177._8_4_ = uVar150;
      auVar177._12_4_ = uVar150;
      auVar95 = vshufps_avx(auVar94,auVar94,0x55);
      auVar94 = vshufps_avx(auVar94,auVar94,0xaa);
      auVar207._0_4_ = fVar166 * auVar94._0_4_;
      auVar207._4_4_ = fVar149 * auVar94._4_4_;
      auVar207._8_4_ = fVar162 * auVar94._8_4_;
      auVar207._12_4_ = fVar163 * auVar94._12_4_;
      auVar95 = vfmadd231ps_fma(auVar207,(undefined1  [16])aVar7,auVar95);
      auVar94 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar6,auVar177);
      lVar28 = (long)iVar83 * 0x44;
      auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar28);
      auVar95 = vshufps_avx512vl(auVar29,auVar29,0xff);
      uVar150 = auVar202._0_4_;
      local_280._4_4_ = uVar150;
      local_280._0_4_ = uVar150;
      local_280._8_4_ = uVar150;
      local_280._12_4_ = uVar150;
      local_280._16_4_ = uVar150;
      local_280._20_4_ = uVar150;
      local_280._24_4_ = uVar150;
      local_280._28_4_ = uVar150;
      auVar187._8_4_ = 1;
      auVar187._0_8_ = 0x100000001;
      auVar187._12_4_ = 1;
      auVar187._16_4_ = 1;
      auVar187._20_4_ = 1;
      auVar187._24_4_ = 1;
      auVar187._28_4_ = 1;
      local_2a0 = vpermps_avx2(auVar187,ZEXT1632(auVar202));
      local_a0 = vbroadcastsd_avx512vl(auVar153);
      auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x484);
      uVar150 = auVar176._0_4_;
      auVar98._4_4_ = uVar150;
      auVar98._0_4_ = uVar150;
      auVar98._8_4_ = uVar150;
      auVar98._12_4_ = uVar150;
      local_2c0._16_4_ = uVar150;
      local_2c0._0_16_ = auVar98;
      local_2c0._20_4_ = uVar150;
      local_2c0._24_4_ = uVar150;
      local_2c0._28_4_ = uVar150;
      local_2e0 = vpermps_avx512vl(auVar187,ZEXT1632(auVar176));
      local_c0 = vbroadcastsd_avx512vl(auVar92);
      auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x908);
      uVar150 = auVar91._0_4_;
      local_300._4_4_ = uVar150;
      local_300._0_4_ = uVar150;
      local_300._8_4_ = uVar150;
      local_300._12_4_ = uVar150;
      local_300._16_4_ = uVar150;
      local_300._20_4_ = uVar150;
      local_300._24_4_ = uVar150;
      local_300._28_4_ = uVar150;
      local_320 = vpermps_avx512vl(auVar187,ZEXT1632(auVar91));
      local_e0 = vbroadcastsd_avx512vl(auVar93);
      auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0xd8c);
      fVar149 = auVar94._0_4_;
      local_340._4_4_ = fVar149;
      local_340._0_4_ = fVar149;
      fStack_338 = fVar149;
      fStack_334 = fVar149;
      fStack_330 = fVar149;
      fStack_32c = fVar149;
      fStack_328 = fVar149;
      register0x0000139c = fVar149;
      _local_360 = vpermps_avx512vl(auVar187,ZEXT1632(auVar94));
      local_100 = vbroadcastsd_avx512vl(auVar95);
      auVar105 = vmulps_avx512vl(_local_340,auVar114);
      auVar103 = vmulps_avx512vl(_local_360,auVar114);
      auVar95 = vfmadd231ps_fma(auVar105,auVar115,local_300);
      auVar105 = vfmadd231ps_avx512vl(auVar103,auVar115,local_320);
      auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar102,local_2c0);
      auVar106 = vfmadd231ps_avx512vl(auVar105,auVar102,local_2e0);
      auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),auVar104,local_280);
      auVar197 = ZEXT3264(auVar107);
      auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar28);
      auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x484);
      auVar108 = vfmadd231ps_avx512vl(auVar106,auVar104,local_2a0);
      auVar192 = ZEXT3264(auVar108);
      auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x908);
      auVar113 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0xd8c);
      auVar101 = vmulps_avx512vl(_local_340,auVar113);
      auVar109 = vmulps_avx512vl(_local_360,auVar113);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar106,local_300);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar106,local_320);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar103,local_2c0);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar103,local_2e0);
      auVar153 = vfmadd231ps_fma(auVar101,auVar105,local_280);
      auVar201 = ZEXT1664(auVar153);
      auVar92 = vfmadd231ps_fma(auVar109,auVar105,local_2a0);
      auVar101 = vsubps_avx512vl(ZEXT1632(auVar153),auVar107);
      auVar109 = vsubps_avx512vl(ZEXT1632(auVar92),auVar108);
      auVar110 = vmulps_avx512vl(auVar108,auVar101);
      auVar99 = vmulps_avx512vl(auVar107,auVar109);
      auVar110 = vsubps_avx512vl(auVar110,auVar99);
      auVar99 = vmulps_avx512vl(local_100,auVar114);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar115,local_e0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar102,local_c0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar104,local_a0);
      auVar100 = vmulps_avx512vl(local_100,auVar113);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar106,local_e0);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar103,local_c0);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar105,local_a0);
      auVar111 = vmulps_avx512vl(auVar109,auVar109);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar101,auVar101);
      auVar112 = vmaxps_avx512vl(auVar99,auVar100);
      auVar112 = vmulps_avx512vl(auVar112,auVar112);
      auVar111 = vmulps_avx512vl(auVar112,auVar111);
      auVar110 = vmulps_avx512vl(auVar110,auVar110);
      uVar25 = vcmpps_avx512vl(auVar110,auVar111,2);
      auVar95 = vblendps_avx(auVar202,local_5b0,8);
      auVar93 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar95 = vandps_avx512vl(auVar95,auVar93);
      auVar96 = vblendps_avx(auVar176,auVar96,8);
      auVar96 = vandps_avx512vl(auVar96,auVar93);
      auVar95 = vmaxps_avx(auVar95,auVar96);
      auVar96 = vblendps_avx(auVar91,auVar97,8);
      auVar97 = vandps_avx512vl(auVar96,auVar93);
      auVar96 = vblendps_avx(auVar94,auVar29,8);
      auVar96 = vandps_avx512vl(auVar96,auVar93);
      auVar96 = vmaxps_avx(auVar97,auVar96);
      auVar96 = vmaxps_avx(auVar95,auVar96);
      auVar97 = vmovshdup_avx(auVar96);
      auVar97 = vmaxss_avx(auVar97,auVar96);
      auVar96 = vshufpd_avx(auVar96,auVar96,1);
      auVar96 = vmaxss_avx(auVar96,auVar97);
      local_570._0_4_ = (undefined4)iVar83;
      local_570._4_12_ = auVar202._4_12_;
      auVar209._4_4_ = local_570._0_4_;
      auVar209._0_4_ = local_570._0_4_;
      auVar209._8_4_ = local_570._0_4_;
      auVar209._12_4_ = local_570._0_4_;
      auVar209._16_4_ = local_570._0_4_;
      auVar209._20_4_ = local_570._0_4_;
      auVar209._24_4_ = local_570._0_4_;
      auVar209._28_4_ = local_570._0_4_;
      uVar26 = vcmpps_avx512vl(auVar209,_DAT_01faff40,0xe);
      bVar87 = (byte)uVar25 & (byte)uVar26;
      fVar166 = auVar96._0_4_ * 4.7683716e-07;
      local_520._0_16_ = ZEXT416((uint)fVar166);
      auVar182._8_4_ = 2;
      auVar182._0_8_ = 0x200000002;
      auVar182._12_4_ = 2;
      auVar182._16_4_ = 2;
      auVar182._20_4_ = 2;
      auVar182._24_4_ = 2;
      auVar182._28_4_ = 2;
      local_480 = vpermps_avx512vl(auVar182,ZEXT1632(auVar202));
      auVar218 = ZEXT3264(local_480);
      local_4a0 = vpermps_avx512vl(auVar182,ZEXT1632(auVar176));
      auVar220 = ZEXT3264(local_4a0);
      auVar110 = vpermps_avx512vl(auVar182,ZEXT1632(auVar91));
      local_140 = vpermps_avx2(auVar182,ZEXT1632(auVar94));
      local_420 = *(undefined4 *)(ray + k * 4 + 0x30);
      uStack_41c = 0;
      uStack_418 = 0;
      uStack_414 = 0;
      if (bVar87 != 0) {
        auVar113 = vmulps_avx512vl(local_140,auVar113);
        auVar106 = vfmadd213ps_avx512vl(auVar106,auVar110,auVar113);
        auVar103 = vfmadd213ps_avx512vl(auVar103,local_4a0,auVar106);
        auVar103 = vfmadd213ps_avx512vl(auVar105,local_480,auVar103);
        auVar114 = vmulps_avx512vl(local_140,auVar114);
        auVar115 = vfmadd213ps_avx512vl(auVar115,auVar110,auVar114);
        auVar106 = vfmadd213ps_avx512vl(auVar102,local_4a0,auVar115);
        auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x1210);
        auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x1694);
        auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x1b18);
        auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x1f9c);
        auVar106 = vfmadd213ps_avx512vl(auVar104,local_480,auVar106);
        auVar204._0_4_ = fVar149 * auVar105._0_4_;
        auVar204._4_4_ = fVar149 * auVar105._4_4_;
        auVar204._8_4_ = fVar149 * auVar105._8_4_;
        auVar204._12_4_ = fVar149 * auVar105._12_4_;
        auVar204._16_4_ = fVar149 * auVar105._16_4_;
        auVar204._20_4_ = fVar149 * auVar105._20_4_;
        auVar204._24_4_ = fVar149 * auVar105._24_4_;
        auVar204._28_4_ = 0;
        auVar104 = vmulps_avx512vl(_local_360,auVar105);
        auVar105 = vmulps_avx512vl(local_140,auVar105);
        auVar113 = vfmadd231ps_avx512vl(auVar204,auVar114,local_300);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar114,local_320);
        auVar114 = vfmadd231ps_avx512vl(auVar105,auVar110,auVar114);
        auVar105 = vfmadd231ps_avx512vl(auVar113,auVar115,local_2c0);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar115,local_2e0);
        auVar113 = vfmadd231ps_avx512vl(auVar114,local_4a0,auVar115);
        auVar96 = vfmadd231ps_fma(auVar105,auVar102,local_280);
        auVar105 = vfmadd231ps_avx512vl(auVar104,auVar102,local_2a0);
        auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x1210);
        auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x1b18);
        auVar114 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x1f9c);
        auVar113 = vfmadd231ps_avx512vl(auVar113,local_480,auVar102);
        auVar37._4_4_ = fVar149 * auVar114._4_4_;
        auVar37._0_4_ = fVar149 * auVar114._0_4_;
        auVar37._8_4_ = fVar149 * auVar114._8_4_;
        auVar37._12_4_ = fVar149 * auVar114._12_4_;
        auVar37._16_4_ = fVar149 * auVar114._16_4_;
        auVar37._20_4_ = fVar149 * auVar114._20_4_;
        auVar37._24_4_ = fVar149 * auVar114._24_4_;
        auVar37._28_4_ = auVar102._28_4_;
        auVar102 = vmulps_avx512vl(_local_360,auVar114);
        auVar114 = vmulps_avx512vl(local_140,auVar114);
        auVar111 = vfmadd231ps_avx512vl(auVar37,auVar115,local_300);
        auVar112 = vfmadd231ps_avx512vl(auVar102,auVar115,local_320);
        auVar218 = ZEXT3264(local_480);
        auVar220 = ZEXT3264(local_4a0);
        auVar219 = ZEXT3264(auVar110);
        auVar115 = vfmadd231ps_avx512vl(auVar114,auVar110,auVar115);
        auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x1694);
        auVar114 = vfmadd231ps_avx512vl(auVar111,auVar102,local_2c0);
        auVar111 = vfmadd231ps_avx512vl(auVar112,auVar102,local_2e0);
        auVar102 = vfmadd231ps_avx512vl(auVar115,local_4a0,auVar102);
        auVar97 = vfmadd231ps_fma(auVar114,auVar104,local_280);
        auVar115 = vfmadd231ps_avx512vl(auVar111,auVar104,local_2a0);
        auVar114 = vfmadd231ps_avx512vl(auVar102,local_480,auVar104);
        auVar213._8_4_ = 0x7fffffff;
        auVar213._0_8_ = 0x7fffffff7fffffff;
        auVar213._12_4_ = 0x7fffffff;
        auVar213._16_4_ = 0x7fffffff;
        auVar213._20_4_ = 0x7fffffff;
        auVar213._24_4_ = 0x7fffffff;
        auVar213._28_4_ = 0x7fffffff;
        auVar104 = vandps_avx(ZEXT1632(auVar96),auVar213);
        auVar102 = vandps_avx(auVar105,auVar213);
        auVar102 = vmaxps_avx(auVar104,auVar102);
        auVar104 = vandps_avx(auVar113,auVar213);
        auVar104 = vmaxps_avx(auVar102,auVar104);
        auVar208._4_4_ = fVar166;
        auVar208._0_4_ = fVar166;
        auVar208._8_4_ = fVar166;
        auVar208._12_4_ = fVar166;
        auVar208._16_4_ = fVar166;
        auVar208._20_4_ = fVar166;
        auVar208._24_4_ = fVar166;
        auVar208._28_4_ = fVar166;
        uVar78 = vcmpps_avx512vl(auVar104,auVar208,1);
        bVar18 = (bool)((byte)uVar78 & 1);
        auVar116._0_4_ = (float)((uint)bVar18 * auVar101._0_4_ | (uint)!bVar18 * auVar96._0_4_);
        bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar18 * auVar101._4_4_ | (uint)!bVar18 * auVar96._4_4_);
        bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar18 * auVar101._8_4_ | (uint)!bVar18 * auVar96._8_4_);
        bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar18 * auVar101._12_4_ | (uint)!bVar18 * auVar96._12_4_);
        fVar149 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar101._16_4_);
        auVar116._16_4_ = fVar149;
        fVar166 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar101._20_4_);
        auVar116._20_4_ = fVar166;
        fVar162 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar101._24_4_);
        auVar116._24_4_ = fVar162;
        uVar79 = (uint)(byte)(uVar78 >> 7) * auVar101._28_4_;
        auVar116._28_4_ = uVar79;
        bVar18 = (bool)((byte)uVar78 & 1);
        auVar117._0_4_ = (float)((uint)bVar18 * auVar109._0_4_ | (uint)!bVar18 * auVar105._0_4_);
        bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar18 * auVar109._4_4_ | (uint)!bVar18 * auVar105._4_4_);
        bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar18 * auVar109._8_4_ | (uint)!bVar18 * auVar105._8_4_);
        bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar18 * auVar109._12_4_ | (uint)!bVar18 * auVar105._12_4_);
        bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar117._16_4_ = (float)((uint)bVar18 * auVar109._16_4_ | (uint)!bVar18 * auVar105._16_4_);
        bVar18 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar117._20_4_ = (float)((uint)bVar18 * auVar109._20_4_ | (uint)!bVar18 * auVar105._20_4_);
        bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar117._24_4_ = (float)((uint)bVar18 * auVar109._24_4_ | (uint)!bVar18 * auVar105._24_4_);
        bVar18 = SUB81(uVar78 >> 7,0);
        auVar117._28_4_ = (uint)bVar18 * auVar109._28_4_ | (uint)!bVar18 * auVar105._28_4_;
        auVar104 = vandps_avx(auVar213,ZEXT1632(auVar97));
        auVar102 = vandps_avx(auVar115,auVar213);
        auVar102 = vmaxps_avx(auVar104,auVar102);
        auVar104 = vandps_avx(auVar114,auVar213);
        auVar104 = vmaxps_avx(auVar102,auVar104);
        uVar78 = vcmpps_avx512vl(auVar104,auVar208,1);
        bVar18 = (bool)((byte)uVar78 & 1);
        auVar118._0_4_ = (float)((uint)bVar18 * auVar101._0_4_ | (uint)!bVar18 * auVar97._0_4_);
        bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar18 * auVar101._4_4_ | (uint)!bVar18 * auVar97._4_4_);
        bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar18 * auVar101._8_4_ | (uint)!bVar18 * auVar97._8_4_);
        bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar18 * auVar101._12_4_ | (uint)!bVar18 * auVar97._12_4_);
        fVar186 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar101._16_4_);
        auVar118._16_4_ = fVar186;
        fVar175 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar101._20_4_);
        auVar118._20_4_ = fVar175;
        fVar163 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar101._24_4_);
        auVar118._24_4_ = fVar163;
        auVar118._28_4_ = (uint)(byte)(uVar78 >> 7) * auVar101._28_4_;
        bVar18 = (bool)((byte)uVar78 & 1);
        auVar119._0_4_ = (float)((uint)bVar18 * auVar109._0_4_ | (uint)!bVar18 * auVar115._0_4_);
        bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar18 * auVar109._4_4_ | (uint)!bVar18 * auVar115._4_4_);
        bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar18 * auVar109._8_4_ | (uint)!bVar18 * auVar115._8_4_);
        bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar18 * auVar109._12_4_ | (uint)!bVar18 * auVar115._12_4_);
        bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar119._16_4_ = (float)((uint)bVar18 * auVar109._16_4_ | (uint)!bVar18 * auVar115._16_4_);
        bVar18 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar119._20_4_ = (float)((uint)bVar18 * auVar109._20_4_ | (uint)!bVar18 * auVar115._20_4_);
        bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar119._24_4_ = (float)((uint)bVar18 * auVar109._24_4_ | (uint)!bVar18 * auVar115._24_4_);
        bVar18 = SUB81(uVar78 >> 7,0);
        auVar119._28_4_ = (uint)bVar18 * auVar109._28_4_ | (uint)!bVar18 * auVar115._28_4_;
        auVar98 = vxorps_avx512vl(auVar98,auVar98);
        auVar104 = vfmadd213ps_avx512vl(auVar116,auVar116,ZEXT1632(auVar98));
        auVar96 = vfmadd231ps_fma(auVar104,auVar117,auVar117);
        auVar104 = vrsqrt14ps_avx512vl(ZEXT1632(auVar96));
        fVar89 = auVar104._0_4_;
        fVar90 = auVar104._4_4_;
        fVar174 = auVar104._8_4_;
        fVar141 = auVar104._12_4_;
        fVar142 = auVar104._16_4_;
        fVar143 = auVar104._20_4_;
        fVar145 = auVar104._24_4_;
        auVar38._4_4_ = fVar90 * fVar90 * fVar90 * auVar96._4_4_ * -0.5;
        auVar38._0_4_ = fVar89 * fVar89 * fVar89 * auVar96._0_4_ * -0.5;
        auVar38._8_4_ = fVar174 * fVar174 * fVar174 * auVar96._8_4_ * -0.5;
        auVar38._12_4_ = fVar141 * fVar141 * fVar141 * auVar96._12_4_ * -0.5;
        auVar38._16_4_ = fVar142 * fVar142 * fVar142 * -0.0;
        auVar38._20_4_ = fVar143 * fVar143 * fVar143 * -0.0;
        auVar38._24_4_ = fVar145 * fVar145 * fVar145 * -0.0;
        auVar38._28_4_ = 0;
        auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar115 = vfmadd231ps_avx512vl(auVar38,auVar102,auVar104);
        auVar39._4_4_ = auVar117._4_4_ * auVar115._4_4_;
        auVar39._0_4_ = auVar117._0_4_ * auVar115._0_4_;
        auVar39._8_4_ = auVar117._8_4_ * auVar115._8_4_;
        auVar39._12_4_ = auVar117._12_4_ * auVar115._12_4_;
        auVar39._16_4_ = auVar117._16_4_ * auVar115._16_4_;
        auVar39._20_4_ = auVar117._20_4_ * auVar115._20_4_;
        auVar39._24_4_ = auVar117._24_4_ * auVar115._24_4_;
        auVar39._28_4_ = auVar104._28_4_;
        auVar40._4_4_ = auVar115._4_4_ * -auVar116._4_4_;
        auVar40._0_4_ = auVar115._0_4_ * -auVar116._0_4_;
        auVar40._8_4_ = auVar115._8_4_ * -auVar116._8_4_;
        auVar40._12_4_ = auVar115._12_4_ * -auVar116._12_4_;
        auVar40._16_4_ = auVar115._16_4_ * -fVar149;
        auVar40._20_4_ = auVar115._20_4_ * -fVar166;
        auVar40._24_4_ = auVar115._24_4_ * -fVar162;
        auVar40._28_4_ = uVar79 ^ 0x80000000;
        auVar104 = vmulps_avx512vl(auVar115,ZEXT1632(auVar98));
        auVar113 = ZEXT1632(auVar98);
        auVar114 = vfmadd213ps_avx512vl(auVar118,auVar118,auVar113);
        auVar96 = vfmadd231ps_fma(auVar114,auVar119,auVar119);
        auVar114 = vrsqrt14ps_avx512vl(ZEXT1632(auVar96));
        fVar166 = auVar114._0_4_;
        fVar149 = auVar114._4_4_;
        fVar162 = auVar114._8_4_;
        fVar89 = auVar114._12_4_;
        fVar90 = auVar114._16_4_;
        fVar174 = auVar114._20_4_;
        fVar141 = auVar114._24_4_;
        auVar41._4_4_ = fVar149 * fVar149 * fVar149 * auVar96._4_4_ * -0.5;
        auVar41._0_4_ = fVar166 * fVar166 * fVar166 * auVar96._0_4_ * -0.5;
        auVar41._8_4_ = fVar162 * fVar162 * fVar162 * auVar96._8_4_ * -0.5;
        auVar41._12_4_ = fVar89 * fVar89 * fVar89 * auVar96._12_4_ * -0.5;
        auVar41._16_4_ = fVar90 * fVar90 * fVar90 * -0.0;
        auVar41._20_4_ = fVar174 * fVar174 * fVar174 * -0.0;
        auVar41._24_4_ = fVar141 * fVar141 * fVar141 * -0.0;
        auVar41._28_4_ = 0;
        auVar102 = vfmadd231ps_avx512vl(auVar41,auVar102,auVar114);
        auVar42._4_4_ = auVar119._4_4_ * auVar102._4_4_;
        auVar42._0_4_ = auVar119._0_4_ * auVar102._0_4_;
        auVar42._8_4_ = auVar119._8_4_ * auVar102._8_4_;
        auVar42._12_4_ = auVar119._12_4_ * auVar102._12_4_;
        auVar42._16_4_ = auVar119._16_4_ * auVar102._16_4_;
        auVar42._20_4_ = auVar119._20_4_ * auVar102._20_4_;
        auVar42._24_4_ = auVar119._24_4_ * auVar102._24_4_;
        auVar42._28_4_ = auVar114._28_4_;
        auVar43._4_4_ = -auVar118._4_4_ * auVar102._4_4_;
        auVar43._0_4_ = -auVar118._0_4_ * auVar102._0_4_;
        auVar43._8_4_ = -auVar118._8_4_ * auVar102._8_4_;
        auVar43._12_4_ = -auVar118._12_4_ * auVar102._12_4_;
        auVar43._16_4_ = -fVar186 * auVar102._16_4_;
        auVar43._20_4_ = -fVar175 * auVar102._20_4_;
        auVar43._24_4_ = -fVar163 * auVar102._24_4_;
        auVar43._28_4_ = auVar115._28_4_;
        auVar102 = vmulps_avx512vl(auVar102,auVar113);
        auVar96 = vfmadd213ps_fma(auVar39,auVar99,auVar107);
        auVar97 = vfmadd213ps_fma(auVar40,auVar99,auVar108);
        auVar115 = vfmadd213ps_avx512vl(auVar104,auVar99,auVar106);
        auVar114 = vfmadd213ps_avx512vl(auVar42,auVar100,ZEXT1632(auVar153));
        auVar202 = vfnmadd213ps_fma(auVar39,auVar99,auVar107);
        auVar95 = vfmadd213ps_fma(auVar43,auVar100,ZEXT1632(auVar92));
        auVar176 = vfnmadd213ps_fma(auVar40,auVar99,auVar108);
        auVar94 = vfmadd213ps_fma(auVar102,auVar100,auVar103);
        auVar105 = vfnmadd231ps_avx512vl(auVar106,auVar99,auVar104);
        auVar29 = vfnmadd213ps_fma(auVar42,auVar100,ZEXT1632(auVar153));
        auVar92 = vfnmadd213ps_fma(auVar43,auVar100,ZEXT1632(auVar92));
        auVar93 = vfnmadd231ps_fma(auVar103,auVar100,auVar102);
        auVar102 = vsubps_avx512vl(auVar114,ZEXT1632(auVar202));
        auVar104 = vsubps_avx(ZEXT1632(auVar95),ZEXT1632(auVar176));
        auVar103 = vsubps_avx512vl(ZEXT1632(auVar94),auVar105);
        auVar106 = vmulps_avx512vl(auVar104,auVar105);
        auVar153 = vfmsub231ps_fma(auVar106,ZEXT1632(auVar176),auVar103);
        auVar44._4_4_ = auVar202._4_4_ * auVar103._4_4_;
        auVar44._0_4_ = auVar202._0_4_ * auVar103._0_4_;
        auVar44._8_4_ = auVar202._8_4_ * auVar103._8_4_;
        auVar44._12_4_ = auVar202._12_4_ * auVar103._12_4_;
        auVar44._16_4_ = auVar103._16_4_ * 0.0;
        auVar44._20_4_ = auVar103._20_4_ * 0.0;
        auVar44._24_4_ = auVar103._24_4_ * 0.0;
        auVar44._28_4_ = auVar103._28_4_;
        auVar103 = vfmsub231ps_avx512vl(auVar44,auVar105,auVar102);
        auVar45._4_4_ = auVar176._4_4_ * auVar102._4_4_;
        auVar45._0_4_ = auVar176._0_4_ * auVar102._0_4_;
        auVar45._8_4_ = auVar176._8_4_ * auVar102._8_4_;
        auVar45._12_4_ = auVar176._12_4_ * auVar102._12_4_;
        auVar45._16_4_ = auVar102._16_4_ * 0.0;
        auVar45._20_4_ = auVar102._20_4_ * 0.0;
        auVar45._24_4_ = auVar102._24_4_ * 0.0;
        auVar45._28_4_ = auVar102._28_4_;
        auVar91 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar202),auVar104);
        auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar113,auVar103);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar113,ZEXT1632(auVar153));
        auVar109 = ZEXT1632(auVar98);
        uVar78 = vcmpps_avx512vl(auVar104,auVar109,2);
        bVar77 = (byte)uVar78;
        fVar89 = (float)((uint)(bVar77 & 1) * auVar96._0_4_ |
                        (uint)!(bool)(bVar77 & 1) * auVar29._0_4_);
        bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
        fVar174 = (float)((uint)bVar18 * auVar96._4_4_ | (uint)!bVar18 * auVar29._4_4_);
        bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
        fVar142 = (float)((uint)bVar18 * auVar96._8_4_ | (uint)!bVar18 * auVar29._8_4_);
        bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
        fVar145 = (float)((uint)bVar18 * auVar96._12_4_ | (uint)!bVar18 * auVar29._12_4_);
        auVar106 = ZEXT1632(CONCAT412(fVar145,CONCAT48(fVar142,CONCAT44(fVar174,fVar89))));
        fVar90 = (float)((uint)(bVar77 & 1) * auVar97._0_4_ |
                        (uint)!(bool)(bVar77 & 1) * auVar92._0_4_);
        bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
        fVar141 = (float)((uint)bVar18 * auVar97._4_4_ | (uint)!bVar18 * auVar92._4_4_);
        bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
        fVar143 = (float)((uint)bVar18 * auVar97._8_4_ | (uint)!bVar18 * auVar92._8_4_);
        bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
        fVar146 = (float)((uint)bVar18 * auVar97._12_4_ | (uint)!bVar18 * auVar92._12_4_);
        auVar113 = ZEXT1632(CONCAT412(fVar146,CONCAT48(fVar143,CONCAT44(fVar141,fVar90))));
        auVar120._0_4_ =
             (float)((uint)(bVar77 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar93._0_4_
                    );
        bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar120._4_4_ = (float)((uint)bVar18 * auVar115._4_4_ | (uint)!bVar18 * auVar93._4_4_);
        bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar120._8_4_ = (float)((uint)bVar18 * auVar115._8_4_ | (uint)!bVar18 * auVar93._8_4_);
        bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar120._12_4_ = (float)((uint)bVar18 * auVar115._12_4_ | (uint)!bVar18 * auVar93._12_4_);
        fVar162 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar115._16_4_);
        auVar120._16_4_ = fVar162;
        fVar149 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar115._20_4_);
        auVar120._20_4_ = fVar149;
        fVar166 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar115._24_4_);
        auVar120._24_4_ = fVar166;
        iVar1 = (uint)(byte)(uVar78 >> 7) * auVar115._28_4_;
        auVar120._28_4_ = iVar1;
        auVar102 = vblendmps_avx512vl(ZEXT1632(auVar202),auVar114);
        auVar121._0_4_ =
             (uint)(bVar77 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar153._0_4_;
        bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar121._4_4_ = (uint)bVar18 * auVar102._4_4_ | (uint)!bVar18 * auVar153._4_4_;
        bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar121._8_4_ = (uint)bVar18 * auVar102._8_4_ | (uint)!bVar18 * auVar153._8_4_;
        bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar121._12_4_ = (uint)bVar18 * auVar102._12_4_ | (uint)!bVar18 * auVar153._12_4_;
        auVar121._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * auVar102._16_4_;
        auVar121._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * auVar102._20_4_;
        auVar121._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * auVar102._24_4_;
        auVar121._28_4_ = (uint)(byte)(uVar78 >> 7) * auVar102._28_4_;
        auVar102 = vblendmps_avx512vl(ZEXT1632(auVar176),ZEXT1632(auVar95));
        auVar122._0_4_ =
             (float)((uint)(bVar77 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar97._0_4_
                    );
        bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar122._4_4_ = (float)((uint)bVar18 * auVar102._4_4_ | (uint)!bVar18 * auVar97._4_4_);
        bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar122._8_4_ = (float)((uint)bVar18 * auVar102._8_4_ | (uint)!bVar18 * auVar97._8_4_);
        bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar122._12_4_ = (float)((uint)bVar18 * auVar102._12_4_ | (uint)!bVar18 * auVar97._12_4_);
        fVar186 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar102._16_4_);
        auVar122._16_4_ = fVar186;
        fVar175 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar102._20_4_);
        auVar122._20_4_ = fVar175;
        fVar163 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar102._24_4_);
        auVar122._24_4_ = fVar163;
        auVar122._28_4_ = (uint)(byte)(uVar78 >> 7) * auVar102._28_4_;
        auVar102 = vblendmps_avx512vl(auVar105,ZEXT1632(auVar94));
        auVar123._0_4_ =
             (float)((uint)(bVar77 & 1) * auVar102._0_4_ |
                    (uint)!(bool)(bVar77 & 1) * auVar115._0_4_);
        bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar123._4_4_ = (float)((uint)bVar18 * auVar102._4_4_ | (uint)!bVar18 * auVar115._4_4_);
        bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar123._8_4_ = (float)((uint)bVar18 * auVar102._8_4_ | (uint)!bVar18 * auVar115._8_4_);
        bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar123._12_4_ = (float)((uint)bVar18 * auVar102._12_4_ | (uint)!bVar18 * auVar115._12_4_);
        bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar123._16_4_ = (float)((uint)bVar18 * auVar102._16_4_ | (uint)!bVar18 * auVar115._16_4_);
        bVar18 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar123._20_4_ = (float)((uint)bVar18 * auVar102._20_4_ | (uint)!bVar18 * auVar115._20_4_);
        bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar123._24_4_ = (float)((uint)bVar18 * auVar102._24_4_ | (uint)!bVar18 * auVar115._24_4_);
        bVar18 = SUB81(uVar78 >> 7,0);
        auVar123._28_4_ = (uint)bVar18 * auVar102._28_4_ | (uint)!bVar18 * auVar115._28_4_;
        auVar124._0_4_ =
             (uint)(bVar77 & 1) * (int)auVar202._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar114._0_4_;
        bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar124._4_4_ = (uint)bVar18 * (int)auVar202._4_4_ | (uint)!bVar18 * auVar114._4_4_;
        bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar124._8_4_ = (uint)bVar18 * (int)auVar202._8_4_ | (uint)!bVar18 * auVar114._8_4_;
        bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar124._12_4_ = (uint)bVar18 * (int)auVar202._12_4_ | (uint)!bVar18 * auVar114._12_4_;
        auVar124._16_4_ = (uint)!(bool)((byte)(uVar78 >> 4) & 1) * auVar114._16_4_;
        auVar124._20_4_ = (uint)!(bool)((byte)(uVar78 >> 5) & 1) * auVar114._20_4_;
        auVar124._24_4_ = (uint)!(bool)((byte)(uVar78 >> 6) & 1) * auVar114._24_4_;
        auVar124._28_4_ = (uint)!SUB81(uVar78 >> 7,0) * auVar114._28_4_;
        bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
        bVar20 = (bool)((byte)(uVar78 >> 2) & 1);
        bVar21 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar125._0_4_ =
             (uint)(bVar77 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar94._0_4_;
        bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar125._4_4_ = (uint)bVar19 * auVar105._4_4_ | (uint)!bVar19 * auVar94._4_4_;
        bVar19 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar125._8_4_ = (uint)bVar19 * auVar105._8_4_ | (uint)!bVar19 * auVar94._8_4_;
        bVar19 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar125._12_4_ = (uint)bVar19 * auVar105._12_4_ | (uint)!bVar19 * auVar94._12_4_;
        auVar125._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * auVar105._16_4_;
        auVar125._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * auVar105._20_4_;
        auVar125._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * auVar105._24_4_;
        iVar2 = (uint)(byte)(uVar78 >> 7) * auVar105._28_4_;
        auVar125._28_4_ = iVar2;
        auVar107 = vsubps_avx512vl(auVar124,auVar106);
        auVar102 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar176._12_4_ |
                                                 (uint)!bVar21 * auVar95._12_4_,
                                                 CONCAT48((uint)bVar20 * (int)auVar176._8_4_ |
                                                          (uint)!bVar20 * auVar95._8_4_,
                                                          CONCAT44((uint)bVar18 *
                                                                   (int)auVar176._4_4_ |
                                                                   (uint)!bVar18 * auVar95._4_4_,
                                                                   (uint)(bVar77 & 1) *
                                                                   (int)auVar176._0_4_ |
                                                                   (uint)!(bool)(bVar77 & 1) *
                                                                   auVar95._0_4_)))),auVar113);
        auVar197 = ZEXT3264(auVar102);
        auVar115 = vsubps_avx(auVar125,auVar120);
        auVar114 = vsubps_avx(auVar106,auVar121);
        auVar201 = ZEXT3264(auVar114);
        auVar105 = vsubps_avx(auVar113,auVar122);
        auVar103 = vsubps_avx(auVar120,auVar123);
        auVar46._4_4_ = auVar115._4_4_ * fVar174;
        auVar46._0_4_ = auVar115._0_4_ * fVar89;
        auVar46._8_4_ = auVar115._8_4_ * fVar142;
        auVar46._12_4_ = auVar115._12_4_ * fVar145;
        auVar46._16_4_ = auVar115._16_4_ * 0.0;
        auVar46._20_4_ = auVar115._20_4_ * 0.0;
        auVar46._24_4_ = auVar115._24_4_ * 0.0;
        auVar46._28_4_ = iVar2;
        auVar96 = vfmsub231ps_fma(auVar46,auVar120,auVar107);
        auVar47._4_4_ = fVar141 * auVar107._4_4_;
        auVar47._0_4_ = fVar90 * auVar107._0_4_;
        auVar47._8_4_ = fVar143 * auVar107._8_4_;
        auVar47._12_4_ = fVar146 * auVar107._12_4_;
        auVar47._16_4_ = auVar107._16_4_ * 0.0;
        auVar47._20_4_ = auVar107._20_4_ * 0.0;
        auVar47._24_4_ = auVar107._24_4_ * 0.0;
        auVar47._28_4_ = auVar104._28_4_;
        auVar97 = vfmsub231ps_fma(auVar47,auVar106,auVar102);
        auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar97),auVar109,ZEXT1632(auVar96));
        auVar188._0_4_ = auVar102._0_4_ * auVar120._0_4_;
        auVar188._4_4_ = auVar102._4_4_ * auVar120._4_4_;
        auVar188._8_4_ = auVar102._8_4_ * auVar120._8_4_;
        auVar188._12_4_ = auVar102._12_4_ * auVar120._12_4_;
        auVar188._16_4_ = auVar102._16_4_ * fVar162;
        auVar188._20_4_ = auVar102._20_4_ * fVar149;
        auVar188._24_4_ = auVar102._24_4_ * fVar166;
        auVar188._28_4_ = 0;
        auVar96 = vfmsub231ps_fma(auVar188,auVar113,auVar115);
        auVar108 = vfmadd231ps_avx512vl(auVar104,auVar109,ZEXT1632(auVar96));
        auVar104 = vmulps_avx512vl(auVar103,auVar121);
        auVar104 = vfmsub231ps_avx512vl(auVar104,auVar114,auVar123);
        auVar48._4_4_ = auVar105._4_4_ * auVar123._4_4_;
        auVar48._0_4_ = auVar105._0_4_ * auVar123._0_4_;
        auVar48._8_4_ = auVar105._8_4_ * auVar123._8_4_;
        auVar48._12_4_ = auVar105._12_4_ * auVar123._12_4_;
        auVar48._16_4_ = auVar105._16_4_ * auVar123._16_4_;
        auVar48._20_4_ = auVar105._20_4_ * auVar123._20_4_;
        auVar48._24_4_ = auVar105._24_4_ * auVar123._24_4_;
        auVar48._28_4_ = auVar123._28_4_;
        auVar96 = vfmsub231ps_fma(auVar48,auVar122,auVar103);
        auVar189._0_4_ = auVar122._0_4_ * auVar114._0_4_;
        auVar189._4_4_ = auVar122._4_4_ * auVar114._4_4_;
        auVar189._8_4_ = auVar122._8_4_ * auVar114._8_4_;
        auVar189._12_4_ = auVar122._12_4_ * auVar114._12_4_;
        auVar189._16_4_ = fVar186 * auVar114._16_4_;
        auVar189._20_4_ = fVar175 * auVar114._20_4_;
        auVar189._24_4_ = fVar163 * auVar114._24_4_;
        auVar189._28_4_ = 0;
        auVar97 = vfmsub231ps_fma(auVar189,auVar105,auVar121);
        auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar97),auVar109,auVar104);
        auVar101 = vfmadd231ps_avx512vl(auVar104,auVar109,ZEXT1632(auVar96));
        auVar192 = ZEXT3264(auVar101);
        auVar104 = vmaxps_avx(auVar108,auVar101);
        uVar25 = vcmpps_avx512vl(auVar104,auVar109,2);
        bVar87 = bVar87 & (byte)uVar25;
        if (bVar87 != 0) {
          uVar150 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar214._4_4_ = uVar150;
          auVar214._0_4_ = uVar150;
          auVar214._8_4_ = uVar150;
          auVar214._12_4_ = uVar150;
          auVar214._16_4_ = uVar150;
          auVar214._20_4_ = uVar150;
          auVar214._24_4_ = uVar150;
          auVar214._28_4_ = uVar150;
          auVar217 = ZEXT3264(auVar214);
          auVar49._4_4_ = auVar103._4_4_ * auVar102._4_4_;
          auVar49._0_4_ = auVar103._0_4_ * auVar102._0_4_;
          auVar49._8_4_ = auVar103._8_4_ * auVar102._8_4_;
          auVar49._12_4_ = auVar103._12_4_ * auVar102._12_4_;
          auVar49._16_4_ = auVar103._16_4_ * auVar102._16_4_;
          auVar49._20_4_ = auVar103._20_4_ * auVar102._20_4_;
          auVar49._24_4_ = auVar103._24_4_ * auVar102._24_4_;
          auVar49._28_4_ = auVar104._28_4_;
          auVar153 = vfmsub231ps_fma(auVar49,auVar105,auVar115);
          auVar50._4_4_ = auVar115._4_4_ * auVar114._4_4_;
          auVar50._0_4_ = auVar115._0_4_ * auVar114._0_4_;
          auVar50._8_4_ = auVar115._8_4_ * auVar114._8_4_;
          auVar50._12_4_ = auVar115._12_4_ * auVar114._12_4_;
          auVar50._16_4_ = auVar115._16_4_ * auVar114._16_4_;
          auVar50._20_4_ = auVar115._20_4_ * auVar114._20_4_;
          auVar50._24_4_ = auVar115._24_4_ * auVar114._24_4_;
          auVar50._28_4_ = auVar115._28_4_;
          auVar95 = vfmsub231ps_fma(auVar50,auVar107,auVar103);
          auVar51._4_4_ = auVar105._4_4_ * auVar107._4_4_;
          auVar51._0_4_ = auVar105._0_4_ * auVar107._0_4_;
          auVar51._8_4_ = auVar105._8_4_ * auVar107._8_4_;
          auVar51._12_4_ = auVar105._12_4_ * auVar107._12_4_;
          auVar51._16_4_ = auVar105._16_4_ * auVar107._16_4_;
          auVar51._20_4_ = auVar105._20_4_ * auVar107._20_4_;
          auVar51._24_4_ = auVar105._24_4_ * auVar107._24_4_;
          auVar51._28_4_ = auVar105._28_4_;
          auVar94 = vfmsub231ps_fma(auVar51,auVar114,auVar102);
          auVar96 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar95),ZEXT1632(auVar94));
          auVar97 = vfmadd231ps_fma(ZEXT1632(auVar96),ZEXT1632(auVar153),
                                    ZEXT1232(ZEXT412(0)) << 0x20);
          auVar104 = vrcp14ps_avx512vl(ZEXT1632(auVar97));
          auVar201 = ZEXT3264(auVar104);
          auVar30._8_4_ = 0x3f800000;
          auVar30._0_8_ = 0x3f8000003f800000;
          auVar30._12_4_ = 0x3f800000;
          auVar30._16_4_ = 0x3f800000;
          auVar30._20_4_ = 0x3f800000;
          auVar30._24_4_ = 0x3f800000;
          auVar30._28_4_ = 0x3f800000;
          auVar102 = vfnmadd213ps_avx512vl(auVar104,ZEXT1632(auVar97),auVar30);
          auVar96 = vfmadd132ps_fma(auVar102,auVar104,auVar104);
          auVar197 = ZEXT1664(auVar96);
          auVar52._4_4_ = auVar94._4_4_ * auVar120._4_4_;
          auVar52._0_4_ = auVar94._0_4_ * auVar120._0_4_;
          auVar52._8_4_ = auVar94._8_4_ * auVar120._8_4_;
          auVar52._12_4_ = auVar94._12_4_ * auVar120._12_4_;
          auVar52._16_4_ = fVar162 * 0.0;
          auVar52._20_4_ = fVar149 * 0.0;
          auVar52._24_4_ = fVar166 * 0.0;
          auVar52._28_4_ = iVar1;
          auVar95 = vfmadd231ps_fma(auVar52,auVar113,ZEXT1632(auVar95));
          auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar106,ZEXT1632(auVar153));
          fVar166 = auVar96._0_4_;
          fVar149 = auVar96._4_4_;
          fVar162 = auVar96._8_4_;
          fVar163 = auVar96._12_4_;
          local_220 = ZEXT1632(CONCAT412(auVar95._12_4_ * fVar163,
                                         CONCAT48(auVar95._8_4_ * fVar162,
                                                  CONCAT44(auVar95._4_4_ * fVar149,
                                                           auVar95._0_4_ * fVar166))));
          auVar203 = ZEXT3264(local_220);
          auVar154._4_4_ = local_420;
          auVar154._0_4_ = local_420;
          auVar154._8_4_ = local_420;
          auVar154._12_4_ = local_420;
          auVar154._16_4_ = local_420;
          auVar154._20_4_ = local_420;
          auVar154._24_4_ = local_420;
          auVar154._28_4_ = local_420;
          uVar25 = vcmpps_avx512vl(local_220,auVar214,2);
          uVar26 = vcmpps_avx512vl(auVar154,local_220,2);
          bVar87 = (byte)uVar25 & (byte)uVar26 & bVar87;
          if (bVar87 != 0) {
            uVar84 = vcmpps_avx512vl(ZEXT1632(auVar97),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar84 = bVar87 & uVar84;
            if ((char)uVar84 != '\0') {
              fVar175 = auVar108._0_4_ * fVar166;
              fVar186 = auVar108._4_4_ * fVar149;
              auVar53._4_4_ = fVar186;
              auVar53._0_4_ = fVar175;
              fVar89 = auVar108._8_4_ * fVar162;
              auVar53._8_4_ = fVar89;
              fVar90 = auVar108._12_4_ * fVar163;
              auVar53._12_4_ = fVar90;
              fVar174 = auVar108._16_4_ * 0.0;
              auVar53._16_4_ = fVar174;
              fVar141 = auVar108._20_4_ * 0.0;
              auVar53._20_4_ = fVar141;
              fVar142 = auVar108._24_4_ * 0.0;
              auVar53._24_4_ = fVar142;
              auVar53._28_4_ = auVar108._28_4_;
              auVar155._8_4_ = 0x3f800000;
              auVar155._0_8_ = 0x3f8000003f800000;
              auVar155._12_4_ = 0x3f800000;
              auVar155._16_4_ = 0x3f800000;
              auVar155._20_4_ = 0x3f800000;
              auVar155._24_4_ = 0x3f800000;
              auVar155._28_4_ = 0x3f800000;
              auVar104 = vsubps_avx(auVar155,auVar53);
              local_260._0_4_ =
                   (float)((uint)(bVar77 & 1) * (int)fVar175 |
                          (uint)!(bool)(bVar77 & 1) * auVar104._0_4_);
              bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
              local_260._4_4_ =
                   (float)((uint)bVar18 * (int)fVar186 | (uint)!bVar18 * auVar104._4_4_);
              bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
              local_260._8_4_ = (float)((uint)bVar18 * (int)fVar89 | (uint)!bVar18 * auVar104._8_4_)
              ;
              bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
              local_260._12_4_ =
                   (float)((uint)bVar18 * (int)fVar90 | (uint)!bVar18 * auVar104._12_4_);
              bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
              local_260._16_4_ =
                   (float)((uint)bVar18 * (int)fVar174 | (uint)!bVar18 * auVar104._16_4_);
              bVar18 = (bool)((byte)(uVar78 >> 5) & 1);
              local_260._20_4_ =
                   (float)((uint)bVar18 * (int)fVar141 | (uint)!bVar18 * auVar104._20_4_);
              bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
              local_260._24_4_ =
                   (float)((uint)bVar18 * (int)fVar142 | (uint)!bVar18 * auVar104._24_4_);
              bVar18 = SUB81(uVar78 >> 7,0);
              local_260._28_4_ =
                   (float)((uint)bVar18 * auVar108._28_4_ | (uint)!bVar18 * auVar104._28_4_);
              auVar104 = vsubps_avx(auVar100,auVar99);
              auVar96 = vfmadd213ps_fma(auVar104,local_260,auVar99);
              uVar150 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
              auVar31._4_4_ = uVar150;
              auVar31._0_4_ = uVar150;
              auVar31._8_4_ = uVar150;
              auVar31._12_4_ = uVar150;
              auVar31._16_4_ = uVar150;
              auVar31._20_4_ = uVar150;
              auVar31._24_4_ = uVar150;
              auVar31._28_4_ = uVar150;
              auVar104 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar96._12_4_ + auVar96._12_4_,
                                                            CONCAT48(auVar96._8_4_ + auVar96._8_4_,
                                                                     CONCAT44(auVar96._4_4_ +
                                                                              auVar96._4_4_,
                                                                              auVar96._0_4_ +
                                                                              auVar96._0_4_)))),
                                         auVar31);
              uVar88 = vcmpps_avx512vl(local_220,auVar104,6);
              uVar84 = uVar84 & uVar88;
              bVar87 = (byte)uVar84;
              if (bVar87 != 0) {
                auVar172._0_4_ = auVar101._0_4_ * fVar166;
                auVar172._4_4_ = auVar101._4_4_ * fVar149;
                auVar172._8_4_ = auVar101._8_4_ * fVar162;
                auVar172._12_4_ = auVar101._12_4_ * fVar163;
                auVar172._16_4_ = auVar101._16_4_ * 0.0;
                auVar172._20_4_ = auVar101._20_4_ * 0.0;
                auVar172._24_4_ = auVar101._24_4_ * 0.0;
                auVar172._28_4_ = 0;
                auVar183._8_4_ = 0x3f800000;
                auVar183._0_8_ = 0x3f8000003f800000;
                auVar183._12_4_ = 0x3f800000;
                auVar183._16_4_ = 0x3f800000;
                auVar183._20_4_ = 0x3f800000;
                auVar183._24_4_ = 0x3f800000;
                auVar183._28_4_ = 0x3f800000;
                auVar104 = vsubps_avx(auVar183,auVar172);
                auVar126._0_4_ =
                     (uint)(bVar77 & 1) * (int)auVar172._0_4_ |
                     (uint)!(bool)(bVar77 & 1) * auVar104._0_4_;
                bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
                auVar126._4_4_ = (uint)bVar18 * (int)auVar172._4_4_ | (uint)!bVar18 * auVar104._4_4_
                ;
                bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
                auVar126._8_4_ = (uint)bVar18 * (int)auVar172._8_4_ | (uint)!bVar18 * auVar104._8_4_
                ;
                bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
                auVar126._12_4_ =
                     (uint)bVar18 * (int)auVar172._12_4_ | (uint)!bVar18 * auVar104._12_4_;
                bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
                auVar126._16_4_ =
                     (uint)bVar18 * (int)auVar172._16_4_ | (uint)!bVar18 * auVar104._16_4_;
                bVar18 = (bool)((byte)(uVar78 >> 5) & 1);
                auVar126._20_4_ =
                     (uint)bVar18 * (int)auVar172._20_4_ | (uint)!bVar18 * auVar104._20_4_;
                bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
                auVar126._24_4_ =
                     (uint)bVar18 * (int)auVar172._24_4_ | (uint)!bVar18 * auVar104._24_4_;
                auVar126._28_4_ = (uint)!SUB81(uVar78 >> 7,0) * auVar104._28_4_;
                auVar32._8_4_ = 0x40000000;
                auVar32._0_8_ = 0x4000000040000000;
                auVar32._12_4_ = 0x40000000;
                auVar32._16_4_ = 0x40000000;
                auVar32._20_4_ = 0x40000000;
                auVar32._24_4_ = 0x40000000;
                auVar32._28_4_ = 0x40000000;
                local_240 = vfmsub132ps_avx512vl(auVar126,auVar183,auVar32);
                local_200 = 0;
                local_1fc = iVar83;
                auVar201 = ZEXT1664(local_5b0);
                local_1f0 = local_5b0;
                local_1e0 = uVar24;
                uStack_1d8 = uVar27;
                local_1d0 = uVar72;
                uStack_1c8 = uVar73;
                local_1c0 = uVar74;
                uStack_1b8 = uVar75;
                if ((pGVar82->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  fVar166 = 1.0 / (float)local_570._0_4_;
                  local_1a0[0] = fVar166 * (local_260._0_4_ + 0.0);
                  local_1a0[1] = fVar166 * (local_260._4_4_ + 1.0);
                  local_1a0[2] = fVar166 * (local_260._8_4_ + 2.0);
                  local_1a0[3] = fVar166 * (local_260._12_4_ + 3.0);
                  fStack_190 = fVar166 * (local_260._16_4_ + 4.0);
                  fStack_18c = fVar166 * (local_260._20_4_ + 5.0);
                  fStack_188 = fVar166 * (local_260._24_4_ + 6.0);
                  fStack_184 = local_260._28_4_ + 7.0;
                  local_180 = local_240;
                  local_160 = local_220;
                  auVar156._8_4_ = 0x7f800000;
                  auVar156._0_8_ = 0x7f8000007f800000;
                  auVar156._12_4_ = 0x7f800000;
                  auVar156._16_4_ = 0x7f800000;
                  auVar156._20_4_ = 0x7f800000;
                  auVar156._24_4_ = 0x7f800000;
                  auVar156._28_4_ = 0x7f800000;
                  auVar104 = vblendmps_avx512vl(auVar156,local_220);
                  auVar127._0_4_ =
                       (uint)(bVar87 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar87 & 1) * 0x7f800000;
                  bVar18 = (bool)((byte)(uVar84 >> 1) & 1);
                  auVar127._4_4_ = (uint)bVar18 * auVar104._4_4_ | (uint)!bVar18 * 0x7f800000;
                  bVar18 = (bool)((byte)(uVar84 >> 2) & 1);
                  auVar127._8_4_ = (uint)bVar18 * auVar104._8_4_ | (uint)!bVar18 * 0x7f800000;
                  bVar18 = (bool)((byte)(uVar84 >> 3) & 1);
                  auVar127._12_4_ = (uint)bVar18 * auVar104._12_4_ | (uint)!bVar18 * 0x7f800000;
                  bVar18 = (bool)((byte)(uVar84 >> 4) & 1);
                  auVar127._16_4_ = (uint)bVar18 * auVar104._16_4_ | (uint)!bVar18 * 0x7f800000;
                  bVar18 = (bool)((byte)(uVar84 >> 5) & 1);
                  auVar127._20_4_ = (uint)bVar18 * auVar104._20_4_ | (uint)!bVar18 * 0x7f800000;
                  bVar18 = (bool)((byte)(uVar84 >> 6) & 1);
                  auVar127._24_4_ = (uint)bVar18 * auVar104._24_4_ | (uint)!bVar18 * 0x7f800000;
                  bVar18 = SUB81(uVar84 >> 7,0);
                  auVar127._28_4_ = (uint)bVar18 * auVar104._28_4_ | (uint)!bVar18 * 0x7f800000;
                  auVar104 = vshufps_avx(auVar127,auVar127,0xb1);
                  auVar104 = vminps_avx(auVar127,auVar104);
                  auVar102 = vshufpd_avx(auVar104,auVar104,5);
                  auVar104 = vminps_avx(auVar104,auVar102);
                  auVar102 = vpermpd_avx2(auVar104,0x4e);
                  auVar104 = vminps_avx(auVar104,auVar102);
                  uVar25 = vcmpps_avx512vl(auVar127,auVar104,0);
                  uVar79 = (uint)uVar84;
                  if (((byte)uVar25 & bVar87) != 0) {
                    uVar79 = (uint)((byte)uVar25 & bVar87);
                  }
                  uVar80 = 0;
                  for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
                    uVar80 = uVar80 + 1;
                  }
                  uVar78 = (ulong)uVar80;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar82->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_560 = vpbroadcastd_avx512vl();
                    auVar96 = vpbroadcastd_avx512vl();
                    local_460._0_16_ = auVar96;
                    local_540 = auVar110;
                    local_4e0 = local_220;
                    local_4c0 = pGVar82;
                    do {
                      local_3c0 = local_1a0[uVar78];
                      local_3b0 = *(undefined4 *)(local_180 + uVar78 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar78 * 4);
                      local_5a0.context = context->user;
                      fVar149 = 1.0 - local_3c0;
                      fVar166 = fVar149 * fVar149 * -3.0;
                      auVar96 = vfmadd231ss_fma(ZEXT416((uint)(fVar149 * fVar149)),
                                                ZEXT416((uint)(local_3c0 * fVar149)),
                                                ZEXT416(0xc0000000));
                      auVar97 = vfmsub132ss_fma(ZEXT416((uint)(local_3c0 * fVar149)),
                                                ZEXT416((uint)(local_3c0 * local_3c0)),
                                                ZEXT416(0x40000000));
                      fVar149 = auVar96._0_4_ * 3.0;
                      fVar162 = auVar97._0_4_ * 3.0;
                      fVar163 = local_3c0 * local_3c0 * 3.0;
                      auVar196._0_4_ = fVar163 * local_5f0;
                      auVar196._4_4_ = fVar163 * fStack_5ec;
                      auVar196._8_4_ = fVar163 * fStack_5e8;
                      auVar196._12_4_ = fVar163 * fStack_5e4;
                      auVar197 = ZEXT1664(auVar196);
                      auVar153._4_4_ = fVar162;
                      auVar153._0_4_ = fVar162;
                      auVar153._8_4_ = fVar162;
                      auVar153._12_4_ = fVar162;
                      auVar96 = vfmadd132ps_fma(auVar153,auVar196,auVar8);
                      auVar181._4_4_ = fVar149;
                      auVar181._0_4_ = fVar149;
                      auVar181._8_4_ = fVar149;
                      auVar181._12_4_ = fVar149;
                      auVar96 = vfmadd132ps_fma(auVar181,auVar96,auVar9);
                      auVar94._4_4_ = fVar166;
                      auVar94._0_4_ = fVar166;
                      auVar94._8_4_ = fVar166;
                      auVar94._12_4_ = fVar166;
                      auVar96 = vfmadd213ps_fma(auVar94,auVar201._0_16_,auVar96);
                      local_3f0 = auVar96._0_4_;
                      local_3e0 = vshufps_avx(auVar96,auVar96,0x55);
                      auVar192 = ZEXT1664(local_3e0);
                      local_3d0 = vshufps_avx(auVar96,auVar96,0xaa);
                      iStack_3ec = local_3f0;
                      iStack_3e8 = local_3f0;
                      iStack_3e4 = local_3f0;
                      fStack_3bc = local_3c0;
                      fStack_3b8 = local_3c0;
                      fStack_3b4 = local_3c0;
                      uStack_3ac = local_3b0;
                      uStack_3a8 = local_3b0;
                      uStack_3a4 = local_3b0;
                      local_3a0 = local_460._0_8_;
                      uStack_398 = local_460._8_8_;
                      local_390 = local_560;
                      vpcmpeqd_avx2(ZEXT1632(local_560),ZEXT1632(local_560));
                      uStack_37c = (local_5a0.context)->instID[0];
                      local_380 = uStack_37c;
                      uStack_378 = uStack_37c;
                      uStack_374 = uStack_37c;
                      uStack_370 = (local_5a0.context)->instPrimID[0];
                      uStack_36c = uStack_370;
                      uStack_368 = uStack_370;
                      uStack_364 = uStack_370;
                      local_5c0 = local_4f0;
                      local_5a0.valid = (int *)local_5c0;
                      local_5a0.geometryUserPtr = pGVar82->userPtr;
                      local_5a0.hit = (RTCHitN *)&local_3f0;
                      local_5a0.N = 4;
                      local_440 = auVar217._0_32_;
                      local_5a0.ray = (RTCRayN *)ray;
                      if (pGVar82->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar192 = ZEXT1664(local_3e0);
                        auVar197 = ZEXT1664(auVar196);
                        (*pGVar82->intersectionFilterN)(&local_5a0);
                        auVar203 = ZEXT3264(local_4e0);
                        auVar217 = ZEXT3264(local_440);
                        auVar219 = ZEXT3264(local_540);
                        auVar220 = ZEXT3264(local_4a0);
                        auVar218 = ZEXT3264(local_480);
                        auVar201 = ZEXT1664(local_5b0);
                        pGVar82 = local_4c0;
                      }
                      uVar88 = vptestmd_avx512vl(local_5c0,local_5c0);
                      if ((uVar88 & 0xf) == 0) {
LAB_01d5b522:
                        *(int *)(ray + k * 4 + 0x80) = auVar217._0_4_;
                      }
                      else {
                        p_Var17 = context->args->filter;
                        if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar82->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar192 = ZEXT1664(auVar192._0_16_);
                          auVar197 = ZEXT1664(auVar197._0_16_);
                          (*p_Var17)(&local_5a0);
                          auVar203 = ZEXT3264(local_4e0);
                          auVar217 = ZEXT3264(local_440);
                          auVar219 = ZEXT3264(local_540);
                          auVar220 = ZEXT3264(local_4a0);
                          auVar218 = ZEXT3264(local_480);
                          auVar201 = ZEXT1664(local_5b0);
                          pGVar82 = local_4c0;
                        }
                        uVar88 = vptestmd_avx512vl(local_5c0,local_5c0);
                        uVar88 = uVar88 & 0xf;
                        bVar87 = (byte)uVar88;
                        if (bVar87 == 0) goto LAB_01d5b522;
                        iVar1 = *(int *)(local_5a0.hit + 4);
                        iVar2 = *(int *)(local_5a0.hit + 8);
                        iVar71 = *(int *)(local_5a0.hit + 0xc);
                        bVar18 = (bool)((byte)(uVar88 >> 1) & 1);
                        bVar19 = (bool)((byte)(uVar88 >> 2) & 1);
                        bVar20 = SUB81(uVar88 >> 3,0);
                        *(uint *)(local_5a0.ray + 0xc0) =
                             (uint)(bVar87 & 1) * *(int *)local_5a0.hit |
                             (uint)!(bool)(bVar87 & 1) * *(int *)(local_5a0.ray + 0xc0);
                        *(uint *)(local_5a0.ray + 0xc4) =
                             (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_5a0.ray + 0xc4);
                        *(uint *)(local_5a0.ray + 200) =
                             (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_5a0.ray + 200);
                        *(uint *)(local_5a0.ray + 0xcc) =
                             (uint)bVar20 * iVar71 | (uint)!bVar20 * *(int *)(local_5a0.ray + 0xcc);
                        iVar1 = *(int *)(local_5a0.hit + 0x14);
                        iVar2 = *(int *)(local_5a0.hit + 0x18);
                        iVar71 = *(int *)(local_5a0.hit + 0x1c);
                        bVar18 = (bool)((byte)(uVar88 >> 1) & 1);
                        bVar19 = (bool)((byte)(uVar88 >> 2) & 1);
                        bVar20 = SUB81(uVar88 >> 3,0);
                        *(uint *)(local_5a0.ray + 0xd0) =
                             (uint)(bVar87 & 1) * *(int *)(local_5a0.hit + 0x10) |
                             (uint)!(bool)(bVar87 & 1) * *(int *)(local_5a0.ray + 0xd0);
                        *(uint *)(local_5a0.ray + 0xd4) =
                             (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_5a0.ray + 0xd4);
                        *(uint *)(local_5a0.ray + 0xd8) =
                             (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_5a0.ray + 0xd8);
                        *(uint *)(local_5a0.ray + 0xdc) =
                             (uint)bVar20 * iVar71 | (uint)!bVar20 * *(int *)(local_5a0.ray + 0xdc);
                        iVar1 = *(int *)(local_5a0.hit + 0x24);
                        iVar2 = *(int *)(local_5a0.hit + 0x28);
                        iVar71 = *(int *)(local_5a0.hit + 0x2c);
                        bVar18 = (bool)((byte)(uVar88 >> 1) & 1);
                        bVar19 = (bool)((byte)(uVar88 >> 2) & 1);
                        bVar20 = SUB81(uVar88 >> 3,0);
                        *(uint *)(local_5a0.ray + 0xe0) =
                             (uint)(bVar87 & 1) * *(int *)(local_5a0.hit + 0x20) |
                             (uint)!(bool)(bVar87 & 1) * *(int *)(local_5a0.ray + 0xe0);
                        *(uint *)(local_5a0.ray + 0xe4) =
                             (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_5a0.ray + 0xe4);
                        *(uint *)(local_5a0.ray + 0xe8) =
                             (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_5a0.ray + 0xe8);
                        *(uint *)(local_5a0.ray + 0xec) =
                             (uint)bVar20 * iVar71 | (uint)!bVar20 * *(int *)(local_5a0.ray + 0xec);
                        iVar1 = *(int *)(local_5a0.hit + 0x34);
                        iVar2 = *(int *)(local_5a0.hit + 0x38);
                        iVar71 = *(int *)(local_5a0.hit + 0x3c);
                        bVar18 = (bool)((byte)(uVar88 >> 1) & 1);
                        bVar19 = (bool)((byte)(uVar88 >> 2) & 1);
                        bVar20 = SUB81(uVar88 >> 3,0);
                        *(uint *)(local_5a0.ray + 0xf0) =
                             (uint)(bVar87 & 1) * *(int *)(local_5a0.hit + 0x30) |
                             (uint)!(bool)(bVar87 & 1) * *(int *)(local_5a0.ray + 0xf0);
                        *(uint *)(local_5a0.ray + 0xf4) =
                             (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_5a0.ray + 0xf4);
                        *(uint *)(local_5a0.ray + 0xf8) =
                             (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_5a0.ray + 0xf8);
                        *(uint *)(local_5a0.ray + 0xfc) =
                             (uint)bVar20 * iVar71 | (uint)!bVar20 * *(int *)(local_5a0.ray + 0xfc);
                        iVar1 = *(int *)(local_5a0.hit + 0x44);
                        iVar2 = *(int *)(local_5a0.hit + 0x48);
                        iVar71 = *(int *)(local_5a0.hit + 0x4c);
                        bVar18 = (bool)((byte)(uVar88 >> 1) & 1);
                        bVar19 = (bool)((byte)(uVar88 >> 2) & 1);
                        bVar20 = SUB81(uVar88 >> 3,0);
                        *(uint *)(local_5a0.ray + 0x100) =
                             (uint)(bVar87 & 1) * *(int *)(local_5a0.hit + 0x40) |
                             (uint)!(bool)(bVar87 & 1) * *(int *)(local_5a0.ray + 0x100);
                        *(uint *)(local_5a0.ray + 0x104) =
                             (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_5a0.ray + 0x104);
                        *(uint *)(local_5a0.ray + 0x108) =
                             (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_5a0.ray + 0x108);
                        *(uint *)(local_5a0.ray + 0x10c) =
                             (uint)bVar20 * iVar71 | (uint)!bVar20 * *(int *)(local_5a0.ray + 0x10c)
                        ;
                        auVar96 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x50));
                        *(undefined1 (*) [16])(local_5a0.ray + 0x110) = auVar96;
                        auVar96 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x60));
                        *(undefined1 (*) [16])(local_5a0.ray + 0x120) = auVar96;
                        auVar96 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x70));
                        *(undefined1 (*) [16])(local_5a0.ray + 0x130) = auVar96;
                        auVar96 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x80));
                        *(undefined1 (*) [16])(local_5a0.ray + 0x140) = auVar96;
                        auVar217 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                      }
                      auVar110 = auVar219._0_32_;
                      bVar87 = ~(byte)(1 << ((uint)uVar78 & 0x1f)) & (byte)uVar84;
                      uVar150 = auVar217._0_4_;
                      auVar160._4_4_ = uVar150;
                      auVar160._0_4_ = uVar150;
                      auVar160._8_4_ = uVar150;
                      auVar160._12_4_ = uVar150;
                      auVar160._16_4_ = uVar150;
                      auVar160._20_4_ = uVar150;
                      auVar160._24_4_ = uVar150;
                      auVar160._28_4_ = uVar150;
                      uVar25 = vcmpps_avx512vl(auVar203._0_32_,auVar160,2);
                      if ((bVar87 & (byte)uVar25) == 0) goto LAB_01d5a44e;
                      bVar87 = bVar87 & (byte)uVar25;
                      uVar84 = (ulong)bVar87;
                      auVar161._8_4_ = 0x7f800000;
                      auVar161._0_8_ = 0x7f8000007f800000;
                      auVar161._12_4_ = 0x7f800000;
                      auVar161._16_4_ = 0x7f800000;
                      auVar161._20_4_ = 0x7f800000;
                      auVar161._24_4_ = 0x7f800000;
                      auVar161._28_4_ = 0x7f800000;
                      auVar104 = vblendmps_avx512vl(auVar161,auVar203._0_32_);
                      auVar140._0_4_ =
                           (uint)(bVar87 & 1) * auVar104._0_4_ |
                           (uint)!(bool)(bVar87 & 1) * 0x7f800000;
                      bVar18 = (bool)(bVar87 >> 1 & 1);
                      auVar140._4_4_ = (uint)bVar18 * auVar104._4_4_ | (uint)!bVar18 * 0x7f800000;
                      bVar18 = (bool)(bVar87 >> 2 & 1);
                      auVar140._8_4_ = (uint)bVar18 * auVar104._8_4_ | (uint)!bVar18 * 0x7f800000;
                      bVar18 = (bool)(bVar87 >> 3 & 1);
                      auVar140._12_4_ = (uint)bVar18 * auVar104._12_4_ | (uint)!bVar18 * 0x7f800000;
                      bVar18 = (bool)(bVar87 >> 4 & 1);
                      auVar140._16_4_ = (uint)bVar18 * auVar104._16_4_ | (uint)!bVar18 * 0x7f800000;
                      bVar18 = (bool)(bVar87 >> 5 & 1);
                      auVar140._20_4_ = (uint)bVar18 * auVar104._20_4_ | (uint)!bVar18 * 0x7f800000;
                      bVar18 = (bool)(bVar87 >> 6 & 1);
                      auVar140._24_4_ = (uint)bVar18 * auVar104._24_4_ | (uint)!bVar18 * 0x7f800000;
                      auVar140._28_4_ =
                           (uint)(bVar87 >> 7) * auVar104._28_4_ |
                           (uint)!(bool)(bVar87 >> 7) * 0x7f800000;
                      auVar104 = vshufps_avx(auVar140,auVar140,0xb1);
                      auVar104 = vminps_avx(auVar140,auVar104);
                      auVar102 = vshufpd_avx(auVar104,auVar104,5);
                      auVar104 = vminps_avx(auVar104,auVar102);
                      auVar102 = vpermpd_avx2(auVar104,0x4e);
                      auVar104 = vminps_avx(auVar104,auVar102);
                      uVar25 = vcmpps_avx512vl(auVar140,auVar104,0);
                      bVar77 = (byte)uVar25 & bVar87;
                      if (bVar77 != 0) {
                        bVar87 = bVar77;
                      }
                      uVar79 = 0;
                      for (uVar80 = (uint)bVar87; (uVar80 & 1) == 0;
                          uVar80 = uVar80 >> 1 | 0x80000000) {
                        uVar79 = uVar79 + 1;
                      }
                      uVar78 = (ulong)uVar79;
                    } while( true );
                  }
                  fVar166 = local_1a0[uVar78];
                  uVar150 = *(undefined4 *)(local_180 + uVar78 * 4);
                  fVar162 = 1.0 - fVar166;
                  fVar149 = fVar162 * fVar162 * -3.0;
                  auVar192 = ZEXT464((uint)fVar149);
                  auVar96 = vfmadd231ss_fma(ZEXT416((uint)(fVar162 * fVar162)),
                                            ZEXT416((uint)(fVar166 * fVar162)),ZEXT416(0xc0000000));
                  auVar97 = vfmsub132ss_fma(ZEXT416((uint)(fVar166 * fVar162)),
                                            ZEXT416((uint)(fVar166 * fVar166)),ZEXT416(0x40000000));
                  fVar162 = auVar96._0_4_ * 3.0;
                  fVar163 = auVar97._0_4_ * 3.0;
                  fVar175 = fVar166 * fVar166 * 3.0;
                  auVar193._0_4_ = fVar175 * local_5f0;
                  auVar193._4_4_ = fVar175 * fStack_5ec;
                  auVar193._8_4_ = fVar175 * fStack_5e8;
                  auVar193._12_4_ = fVar175 * fStack_5e4;
                  auVar197 = ZEXT1664(auVar193);
                  auVar167._4_4_ = fVar163;
                  auVar167._0_4_ = fVar163;
                  auVar167._8_4_ = fVar163;
                  auVar167._12_4_ = fVar163;
                  auVar96 = vfmadd132ps_fma(auVar167,auVar193,*pauVar4);
                  auVar178._4_4_ = fVar162;
                  auVar178._0_4_ = fVar162;
                  auVar178._8_4_ = fVar162;
                  auVar178._12_4_ = fVar162;
                  auVar96 = vfmadd132ps_fma(auVar178,auVar96,*pauVar3);
                  auVar168._4_4_ = fVar149;
                  auVar168._0_4_ = fVar149;
                  auVar168._8_4_ = fVar149;
                  auVar168._12_4_ = fVar149;
                  auVar96 = vfmadd213ps_fma(auVar168,local_5b0,auVar96);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar78 * 4);
                  *(int *)(ray + k * 4 + 0xc0) = auVar96._0_4_;
                  uVar16 = vextractps_avx(auVar96,1);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar16;
                  uVar16 = vextractps_avx(auVar96,2);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar16;
                  *(float *)(ray + k * 4 + 0xf0) = fVar166;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar150;
                  *(uint *)(ray + k * 4 + 0x110) = uVar15;
                  *(uint *)(ray + k * 4 + 0x120) = uVar85;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
              }
            }
          }
        }
      }
LAB_01d5a44e:
      if (8 < iVar83) {
        auVar104 = vpbroadcastd_avx512vl();
        auVar219 = ZEXT3264(auVar104);
        local_440._4_4_ = local_520._0_4_;
        local_440._0_4_ = local_520._0_4_;
        local_440._8_4_ = local_520._0_4_;
        local_440._12_4_ = local_520._0_4_;
        local_440._16_4_ = local_520._0_4_;
        local_440._20_4_ = local_520._0_4_;
        local_440._24_4_ = local_520._0_4_;
        local_440._28_4_ = local_520._0_4_;
        uStack_41c = local_420;
        uStack_418 = local_420;
        uStack_414 = local_420;
        uStack_410 = local_420;
        uStack_40c = local_420;
        uStack_408 = local_420;
        uStack_404 = local_420;
        fStack_4b8 = 1.0 / (float)local_570._0_4_;
        local_570 = vpbroadcastd_avx512vl();
        local_560 = vpbroadcastd_avx512vl();
        lVar81 = 8;
        local_540 = auVar110;
        fStack_4b4 = fStack_4b8;
        fStack_4b0 = fStack_4b8;
        fStack_4ac = fStack_4b8;
        fStack_4a8 = fStack_4b8;
        fStack_4a4 = fStack_4b8;
        local_4c0._0_4_ = fStack_4b8;
        local_4c0._4_4_ = fStack_4b8;
LAB_01d5a4f7:
        auVar104 = vpbroadcastd_avx512vl();
        auVar104 = vpor_avx2(auVar104,_DAT_01fe9900);
        uVar26 = vpcmpgtd_avx512vl(auVar219._0_32_,auVar104);
        auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar81 * 4 + lVar28);
        auVar102 = *(undefined1 (*) [32])(lVar28 + 0x21aa768 + lVar81 * 4);
        auVar115 = *(undefined1 (*) [32])(lVar28 + 0x21aabec + lVar81 * 4);
        auVar114 = *(undefined1 (*) [32])(lVar28 + 0x21ab070 + lVar81 * 4);
        auVar203._0_4_ = auVar114._0_4_ * (float)local_340._0_4_;
        auVar203._4_4_ = auVar114._4_4_ * (float)local_340._4_4_;
        auVar203._8_4_ = auVar114._8_4_ * fStack_338;
        auVar203._12_4_ = auVar114._12_4_ * fStack_334;
        auVar203._16_4_ = auVar114._16_4_ * fStack_330;
        auVar203._20_4_ = auVar114._20_4_ * fStack_32c;
        auVar203._28_36_ = auVar197._28_36_;
        auVar203._24_4_ = auVar114._24_4_ * fStack_328;
        auVar197._0_4_ = auVar114._0_4_ * (float)local_360._0_4_;
        auVar197._4_4_ = auVar114._4_4_ * (float)local_360._4_4_;
        auVar197._8_4_ = auVar114._8_4_ * fStack_358;
        auVar197._12_4_ = auVar114._12_4_ * fStack_354;
        auVar197._16_4_ = auVar114._16_4_ * fStack_350;
        auVar197._20_4_ = auVar114._20_4_ * fStack_34c;
        auVar197._28_36_ = auVar192._28_36_;
        auVar197._24_4_ = auVar114._24_4_ * fStack_348;
        auVar105 = vmulps_avx512vl(local_100,auVar114);
        local_480 = auVar218._0_32_;
        auVar103 = vfmadd231ps_avx512vl(auVar203._0_32_,auVar115,local_300);
        auVar106 = vfmadd231ps_avx512vl(auVar197._0_32_,auVar115,local_320);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar115,local_e0);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar102,local_2c0);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar102,local_2e0);
        auVar113 = vfmadd231ps_avx512vl(auVar105,auVar102,local_c0);
        auVar96 = vfmadd231ps_fma(auVar103,auVar104,local_280);
        auVar197 = ZEXT1664(auVar96);
        auVar97 = vfmadd231ps_fma(auVar106,auVar104,local_2a0);
        auVar192 = ZEXT1664(auVar97);
        auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar81 * 4 + lVar28);
        auVar103 = *(undefined1 (*) [32])(lVar28 + 0x21acb88 + lVar81 * 4);
        auVar101 = vfmadd231ps_avx512vl(auVar113,auVar104,local_a0);
        auVar106 = *(undefined1 (*) [32])(lVar28 + 0x21ad00c + lVar81 * 4);
        auVar113 = *(undefined1 (*) [32])(lVar28 + 0x21ad490 + lVar81 * 4);
        auVar218._0_4_ = auVar113._0_4_ * (float)local_340._0_4_;
        auVar218._4_4_ = auVar113._4_4_ * (float)local_340._4_4_;
        auVar218._8_4_ = auVar113._8_4_ * fStack_338;
        auVar218._12_4_ = auVar113._12_4_ * fStack_334;
        auVar218._16_4_ = auVar113._16_4_ * fStack_330;
        auVar218._20_4_ = auVar113._20_4_ * fStack_32c;
        auVar218._28_36_ = auVar201._28_36_;
        auVar218._24_4_ = auVar113._24_4_ * fStack_328;
        auVar54._4_4_ = auVar113._4_4_ * (float)local_360._4_4_;
        auVar54._0_4_ = auVar113._0_4_ * (float)local_360._0_4_;
        auVar54._8_4_ = auVar113._8_4_ * fStack_358;
        auVar54._12_4_ = auVar113._12_4_ * fStack_354;
        auVar54._16_4_ = auVar113._16_4_ * fStack_350;
        auVar54._20_4_ = auVar113._20_4_ * fStack_34c;
        auVar54._24_4_ = auVar113._24_4_ * fStack_348;
        auVar54._28_4_ = uStack_344;
        auVar107 = vmulps_avx512vl(local_100,auVar113);
        auVar108 = vfmadd231ps_avx512vl(auVar218._0_32_,auVar106,local_300);
        auVar218 = ZEXT3264(local_480);
        auVar109 = vfmadd231ps_avx512vl(auVar54,auVar106,local_320);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar106,local_e0);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar103,local_2c0);
        auVar109 = vfmadd231ps_avx512vl(auVar109,auVar103,local_2e0);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar103,local_c0);
        auVar8 = vfmadd231ps_fma(auVar108,auVar105,local_280);
        auVar201 = ZEXT1664(auVar8);
        auVar9 = vfmadd231ps_fma(auVar109,auVar105,local_2a0);
        auVar109 = vfmadd231ps_avx512vl(auVar107,auVar105,local_a0);
        auVar110 = vmaxps_avx512vl(auVar101,auVar109);
        auVar107 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar96));
        auVar108 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar97));
        auVar99 = vmulps_avx512vl(ZEXT1632(auVar97),auVar107);
        auVar100 = vmulps_avx512vl(ZEXT1632(auVar96),auVar108);
        auVar99 = vsubps_avx512vl(auVar99,auVar100);
        auVar100 = vmulps_avx512vl(auVar108,auVar108);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar107,auVar107);
        auVar110 = vmulps_avx512vl(auVar110,auVar110);
        auVar110 = vmulps_avx512vl(auVar110,auVar100);
        auVar99 = vmulps_avx512vl(auVar99,auVar99);
        uVar25 = vcmpps_avx512vl(auVar99,auVar110,2);
        bVar87 = (byte)uVar26 & (byte)uVar25;
        if (bVar87 != 0) {
          auVar113 = vmulps_avx512vl(local_140,auVar113);
          auVar106 = vfmadd213ps_avx512vl(auVar106,local_540,auVar113);
          local_4a0 = auVar220._0_32_;
          auVar103 = vfmadd213ps_avx512vl(auVar103,local_4a0,auVar106);
          auVar105 = vfmadd213ps_avx512vl(auVar105,local_480,auVar103);
          auVar114 = vmulps_avx512vl(local_140,auVar114);
          auVar115 = vfmadd213ps_avx512vl(auVar115,local_540,auVar114);
          auVar102 = vfmadd213ps_avx512vl(auVar102,local_4a0,auVar115);
          auVar103 = vfmadd213ps_avx512vl(auVar104,local_480,auVar102);
          auVar104 = *(undefined1 (*) [32])(lVar28 + 0x21ab4f4 + lVar81 * 4);
          auVar102 = *(undefined1 (*) [32])(lVar28 + 0x21ab978 + lVar81 * 4);
          auVar115 = *(undefined1 (*) [32])(lVar28 + 0x21abdfc + lVar81 * 4);
          auVar114 = *(undefined1 (*) [32])(lVar28 + 0x21ac280 + lVar81 * 4);
          auVar106 = vmulps_avx512vl(_local_340,auVar114);
          auVar113 = vmulps_avx512vl(_local_360,auVar114);
          auVar114 = vmulps_avx512vl(local_140,auVar114);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar115,local_300);
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar115,local_320);
          auVar95 = vfmadd231ps_fma(auVar114,auVar115,local_540);
          auVar115 = vfmadd231ps_avx512vl(auVar106,auVar102,local_2c0);
          auVar114 = vfmadd231ps_avx512vl(auVar113,auVar102,local_2e0);
          auVar102 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),local_4a0,auVar102);
          auVar106 = vfmadd231ps_avx512vl(auVar115,auVar104,local_280);
          auVar114 = vfmadd231ps_avx512vl(auVar114,auVar104,local_2a0);
          auVar113 = vfmadd231ps_avx512vl(auVar102,local_480,auVar104);
          auVar104 = *(undefined1 (*) [32])(lVar28 + 0x21ad914 + lVar81 * 4);
          auVar102 = *(undefined1 (*) [32])(lVar28 + 0x21ae21c + lVar81 * 4);
          auVar115 = *(undefined1 (*) [32])(lVar28 + 0x21ae6a0 + lVar81 * 4);
          auVar110 = vmulps_avx512vl(_local_340,auVar115);
          auVar99 = vmulps_avx512vl(_local_360,auVar115);
          auVar115 = vmulps_avx512vl(local_140,auVar115);
          auVar110 = vfmadd231ps_avx512vl(auVar110,auVar102,local_300);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar102,local_320);
          auVar115 = vfmadd231ps_avx512vl(auVar115,local_540,auVar102);
          auVar102 = *(undefined1 (*) [32])(lVar28 + 0x21add98 + lVar81 * 4);
          auVar110 = vfmadd231ps_avx512vl(auVar110,auVar102,local_2c0);
          auVar218 = ZEXT3264(local_480);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar102,local_2e0);
          auVar102 = vfmadd231ps_avx512vl(auVar115,local_4a0,auVar102);
          auVar115 = vfmadd231ps_avx512vl(auVar110,auVar104,local_280);
          auVar110 = vfmadd231ps_avx512vl(auVar99,auVar104,local_2a0);
          auVar102 = vfmadd231ps_avx512vl(auVar102,local_480,auVar104);
          auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar106,auVar99);
          vandps_avx512vl(auVar114,auVar99);
          auVar104 = vmaxps_avx(auVar99,auVar99);
          vandps_avx512vl(auVar113,auVar99);
          auVar104 = vmaxps_avx(auVar104,auVar99);
          uVar78 = vcmpps_avx512vl(auVar104,local_440,1);
          bVar18 = (bool)((byte)uVar78 & 1);
          auVar128._0_4_ = (float)((uint)bVar18 * auVar107._0_4_ | (uint)!bVar18 * auVar106._0_4_);
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar128._4_4_ = (float)((uint)bVar18 * auVar107._4_4_ | (uint)!bVar18 * auVar106._4_4_);
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar128._8_4_ = (float)((uint)bVar18 * auVar107._8_4_ | (uint)!bVar18 * auVar106._8_4_);
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar128._12_4_ =
               (float)((uint)bVar18 * auVar107._12_4_ | (uint)!bVar18 * auVar106._12_4_);
          bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
          auVar128._16_4_ =
               (float)((uint)bVar18 * auVar107._16_4_ | (uint)!bVar18 * auVar106._16_4_);
          bVar18 = (bool)((byte)(uVar78 >> 5) & 1);
          auVar128._20_4_ =
               (float)((uint)bVar18 * auVar107._20_4_ | (uint)!bVar18 * auVar106._20_4_);
          bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
          auVar128._24_4_ =
               (float)((uint)bVar18 * auVar107._24_4_ | (uint)!bVar18 * auVar106._24_4_);
          bVar18 = SUB81(uVar78 >> 7,0);
          auVar128._28_4_ = (uint)bVar18 * auVar107._28_4_ | (uint)!bVar18 * auVar106._28_4_;
          bVar18 = (bool)((byte)uVar78 & 1);
          auVar129._0_4_ = (float)((uint)bVar18 * auVar108._0_4_ | (uint)!bVar18 * auVar114._0_4_);
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar129._4_4_ = (float)((uint)bVar18 * auVar108._4_4_ | (uint)!bVar18 * auVar114._4_4_);
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar129._8_4_ = (float)((uint)bVar18 * auVar108._8_4_ | (uint)!bVar18 * auVar114._8_4_);
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar129._12_4_ =
               (float)((uint)bVar18 * auVar108._12_4_ | (uint)!bVar18 * auVar114._12_4_);
          bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
          auVar129._16_4_ =
               (float)((uint)bVar18 * auVar108._16_4_ | (uint)!bVar18 * auVar114._16_4_);
          bVar18 = (bool)((byte)(uVar78 >> 5) & 1);
          auVar129._20_4_ =
               (float)((uint)bVar18 * auVar108._20_4_ | (uint)!bVar18 * auVar114._20_4_);
          bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
          auVar129._24_4_ =
               (float)((uint)bVar18 * auVar108._24_4_ | (uint)!bVar18 * auVar114._24_4_);
          bVar18 = SUB81(uVar78 >> 7,0);
          auVar129._28_4_ = (uint)bVar18 * auVar108._28_4_ | (uint)!bVar18 * auVar114._28_4_;
          vandps_avx512vl(auVar115,auVar99);
          vandps_avx512vl(auVar110,auVar99);
          auVar104 = vmaxps_avx(auVar129,auVar129);
          vandps_avx512vl(auVar102,auVar99);
          auVar104 = vmaxps_avx(auVar104,auVar129);
          uVar78 = vcmpps_avx512vl(auVar104,local_440,1);
          bVar18 = (bool)((byte)uVar78 & 1);
          auVar130._0_4_ = (uint)bVar18 * auVar107._0_4_ | (uint)!bVar18 * auVar115._0_4_;
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar130._4_4_ = (uint)bVar18 * auVar107._4_4_ | (uint)!bVar18 * auVar115._4_4_;
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar130._8_4_ = (uint)bVar18 * auVar107._8_4_ | (uint)!bVar18 * auVar115._8_4_;
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar130._12_4_ = (uint)bVar18 * auVar107._12_4_ | (uint)!bVar18 * auVar115._12_4_;
          bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
          auVar130._16_4_ = (uint)bVar18 * auVar107._16_4_ | (uint)!bVar18 * auVar115._16_4_;
          bVar18 = (bool)((byte)(uVar78 >> 5) & 1);
          auVar130._20_4_ = (uint)bVar18 * auVar107._20_4_ | (uint)!bVar18 * auVar115._20_4_;
          bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
          auVar130._24_4_ = (uint)bVar18 * auVar107._24_4_ | (uint)!bVar18 * auVar115._24_4_;
          bVar18 = SUB81(uVar78 >> 7,0);
          auVar130._28_4_ = (uint)bVar18 * auVar107._28_4_ | (uint)!bVar18 * auVar115._28_4_;
          bVar18 = (bool)((byte)uVar78 & 1);
          auVar131._0_4_ = (float)((uint)bVar18 * auVar108._0_4_ | (uint)!bVar18 * auVar110._0_4_);
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar131._4_4_ = (float)((uint)bVar18 * auVar108._4_4_ | (uint)!bVar18 * auVar110._4_4_);
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar131._8_4_ = (float)((uint)bVar18 * auVar108._8_4_ | (uint)!bVar18 * auVar110._8_4_);
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar131._12_4_ =
               (float)((uint)bVar18 * auVar108._12_4_ | (uint)!bVar18 * auVar110._12_4_);
          bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
          auVar131._16_4_ =
               (float)((uint)bVar18 * auVar108._16_4_ | (uint)!bVar18 * auVar110._16_4_);
          bVar18 = (bool)((byte)(uVar78 >> 5) & 1);
          auVar131._20_4_ =
               (float)((uint)bVar18 * auVar108._20_4_ | (uint)!bVar18 * auVar110._20_4_);
          bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
          auVar131._24_4_ =
               (float)((uint)bVar18 * auVar108._24_4_ | (uint)!bVar18 * auVar110._24_4_);
          bVar18 = SUB81(uVar78 >> 7,0);
          auVar131._28_4_ = (uint)bVar18 * auVar108._28_4_ | (uint)!bVar18 * auVar110._28_4_;
          auVar205._8_4_ = 0x80000000;
          auVar205._0_8_ = 0x8000000080000000;
          auVar205._12_4_ = 0x80000000;
          auVar205._16_4_ = 0x80000000;
          auVar205._20_4_ = 0x80000000;
          auVar205._24_4_ = 0x80000000;
          auVar205._28_4_ = 0x80000000;
          auVar104 = vxorps_avx512vl(auVar130,auVar205);
          auVar98 = vxorps_avx512vl(auVar99._0_16_,auVar99._0_16_);
          auVar102 = vfmadd213ps_avx512vl(auVar128,auVar128,ZEXT1632(auVar98));
          auVar95 = vfmadd231ps_fma(auVar102,auVar129,auVar129);
          auVar102 = vrsqrt14ps_avx512vl(ZEXT1632(auVar95));
          auVar215._8_4_ = 0xbf000000;
          auVar215._0_8_ = 0xbf000000bf000000;
          auVar215._12_4_ = 0xbf000000;
          auVar215._16_4_ = 0xbf000000;
          auVar215._20_4_ = 0xbf000000;
          auVar215._24_4_ = 0xbf000000;
          auVar215._28_4_ = 0xbf000000;
          fVar166 = auVar102._0_4_;
          fVar149 = auVar102._4_4_;
          fVar162 = auVar102._8_4_;
          fVar163 = auVar102._12_4_;
          fVar175 = auVar102._16_4_;
          fVar186 = auVar102._20_4_;
          fVar89 = auVar102._24_4_;
          auVar55._4_4_ = fVar149 * fVar149 * fVar149 * auVar95._4_4_ * -0.5;
          auVar55._0_4_ = fVar166 * fVar166 * fVar166 * auVar95._0_4_ * -0.5;
          auVar55._8_4_ = fVar162 * fVar162 * fVar162 * auVar95._8_4_ * -0.5;
          auVar55._12_4_ = fVar163 * fVar163 * fVar163 * auVar95._12_4_ * -0.5;
          auVar55._16_4_ = fVar175 * fVar175 * fVar175 * -0.0;
          auVar55._20_4_ = fVar186 * fVar186 * fVar186 * -0.0;
          auVar55._24_4_ = fVar89 * fVar89 * fVar89 * -0.0;
          auVar55._28_4_ = auVar129._28_4_;
          auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar102 = vfmadd231ps_avx512vl(auVar55,auVar115,auVar102);
          auVar56._4_4_ = auVar129._4_4_ * auVar102._4_4_;
          auVar56._0_4_ = auVar129._0_4_ * auVar102._0_4_;
          auVar56._8_4_ = auVar129._8_4_ * auVar102._8_4_;
          auVar56._12_4_ = auVar129._12_4_ * auVar102._12_4_;
          auVar56._16_4_ = auVar129._16_4_ * auVar102._16_4_;
          auVar56._20_4_ = auVar129._20_4_ * auVar102._20_4_;
          auVar56._24_4_ = auVar129._24_4_ * auVar102._24_4_;
          auVar56._28_4_ = 0;
          auVar57._4_4_ = auVar102._4_4_ * -auVar128._4_4_;
          auVar57._0_4_ = auVar102._0_4_ * -auVar128._0_4_;
          auVar57._8_4_ = auVar102._8_4_ * -auVar128._8_4_;
          auVar57._12_4_ = auVar102._12_4_ * -auVar128._12_4_;
          auVar57._16_4_ = auVar102._16_4_ * -auVar128._16_4_;
          auVar57._20_4_ = auVar102._20_4_ * -auVar128._20_4_;
          auVar57._24_4_ = auVar102._24_4_ * -auVar128._24_4_;
          auVar57._28_4_ = auVar129._28_4_;
          auVar114 = vmulps_avx512vl(auVar102,ZEXT1632(auVar98));
          auVar113 = ZEXT1632(auVar98);
          auVar102 = vfmadd213ps_avx512vl(auVar130,auVar130,auVar113);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar131,auVar131);
          auVar106 = vrsqrt14ps_avx512vl(auVar102);
          auVar102 = vmulps_avx512vl(auVar102,auVar215);
          fVar166 = auVar106._0_4_;
          fVar149 = auVar106._4_4_;
          fVar162 = auVar106._8_4_;
          fVar163 = auVar106._12_4_;
          fVar175 = auVar106._16_4_;
          fVar186 = auVar106._20_4_;
          fVar89 = auVar106._24_4_;
          auVar58._4_4_ = fVar149 * fVar149 * fVar149 * auVar102._4_4_;
          auVar58._0_4_ = fVar166 * fVar166 * fVar166 * auVar102._0_4_;
          auVar58._8_4_ = fVar162 * fVar162 * fVar162 * auVar102._8_4_;
          auVar58._12_4_ = fVar163 * fVar163 * fVar163 * auVar102._12_4_;
          auVar58._16_4_ = fVar175 * fVar175 * fVar175 * auVar102._16_4_;
          auVar58._20_4_ = fVar186 * fVar186 * fVar186 * auVar102._20_4_;
          auVar58._24_4_ = fVar89 * fVar89 * fVar89 * auVar102._24_4_;
          auVar58._28_4_ = auVar102._28_4_;
          auVar102 = vfmadd231ps_avx512vl(auVar58,auVar115,auVar106);
          auVar59._4_4_ = auVar131._4_4_ * auVar102._4_4_;
          auVar59._0_4_ = auVar131._0_4_ * auVar102._0_4_;
          auVar59._8_4_ = auVar131._8_4_ * auVar102._8_4_;
          auVar59._12_4_ = auVar131._12_4_ * auVar102._12_4_;
          auVar59._16_4_ = auVar131._16_4_ * auVar102._16_4_;
          auVar59._20_4_ = auVar131._20_4_ * auVar102._20_4_;
          auVar59._24_4_ = auVar131._24_4_ * auVar102._24_4_;
          auVar59._28_4_ = auVar106._28_4_;
          auVar60._4_4_ = auVar102._4_4_ * auVar104._4_4_;
          auVar60._0_4_ = auVar102._0_4_ * auVar104._0_4_;
          auVar60._8_4_ = auVar102._8_4_ * auVar104._8_4_;
          auVar60._12_4_ = auVar102._12_4_ * auVar104._12_4_;
          auVar60._16_4_ = auVar102._16_4_ * auVar104._16_4_;
          auVar60._20_4_ = auVar102._20_4_ * auVar104._20_4_;
          auVar60._24_4_ = auVar102._24_4_ * auVar104._24_4_;
          auVar60._28_4_ = auVar104._28_4_;
          auVar104 = vmulps_avx512vl(auVar102,auVar113);
          auVar95 = vfmadd213ps_fma(auVar56,auVar101,ZEXT1632(auVar96));
          auVar153 = vfmadd213ps_fma(auVar57,auVar101,ZEXT1632(auVar97));
          auVar115 = vfmadd213ps_avx512vl(auVar114,auVar101,auVar103);
          auVar106 = vfmadd213ps_avx512vl(auVar59,auVar109,ZEXT1632(auVar8));
          auVar91 = vfnmadd213ps_fma(auVar56,auVar101,ZEXT1632(auVar96));
          auVar96 = vfmadd213ps_fma(auVar60,auVar109,ZEXT1632(auVar9));
          auVar202 = vfnmadd213ps_fma(auVar57,auVar101,ZEXT1632(auVar97));
          auVar97 = vfmadd213ps_fma(auVar104,auVar109,auVar105);
          auVar29 = vfnmadd231ps_fma(auVar103,auVar101,auVar114);
          auVar176 = vfnmadd213ps_fma(auVar59,auVar109,ZEXT1632(auVar8));
          auVar92 = vfnmadd213ps_fma(auVar60,auVar109,ZEXT1632(auVar9));
          auVar93 = vfnmadd231ps_fma(auVar105,auVar109,auVar104);
          auVar105 = vsubps_avx512vl(auVar106,ZEXT1632(auVar91));
          auVar104 = vsubps_avx(ZEXT1632(auVar96),ZEXT1632(auVar202));
          auVar102 = vsubps_avx(ZEXT1632(auVar97),ZEXT1632(auVar29));
          auVar61._4_4_ = auVar104._4_4_ * auVar29._4_4_;
          auVar61._0_4_ = auVar104._0_4_ * auVar29._0_4_;
          auVar61._8_4_ = auVar104._8_4_ * auVar29._8_4_;
          auVar61._12_4_ = auVar104._12_4_ * auVar29._12_4_;
          auVar61._16_4_ = auVar104._16_4_ * 0.0;
          auVar61._20_4_ = auVar104._20_4_ * 0.0;
          auVar61._24_4_ = auVar104._24_4_ * 0.0;
          auVar61._28_4_ = auVar114._28_4_;
          auVar8 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar202),auVar102);
          auVar62._4_4_ = auVar102._4_4_ * auVar91._4_4_;
          auVar62._0_4_ = auVar102._0_4_ * auVar91._0_4_;
          auVar62._8_4_ = auVar102._8_4_ * auVar91._8_4_;
          auVar62._12_4_ = auVar102._12_4_ * auVar91._12_4_;
          auVar62._16_4_ = auVar102._16_4_ * 0.0;
          auVar62._20_4_ = auVar102._20_4_ * 0.0;
          auVar62._24_4_ = auVar102._24_4_ * 0.0;
          auVar62._28_4_ = auVar102._28_4_;
          auVar9 = vfmsub231ps_fma(auVar62,ZEXT1632(auVar29),auVar105);
          auVar63._4_4_ = auVar202._4_4_ * auVar105._4_4_;
          auVar63._0_4_ = auVar202._0_4_ * auVar105._0_4_;
          auVar63._8_4_ = auVar202._8_4_ * auVar105._8_4_;
          auVar63._12_4_ = auVar202._12_4_ * auVar105._12_4_;
          auVar63._16_4_ = auVar105._16_4_ * 0.0;
          auVar63._20_4_ = auVar105._20_4_ * 0.0;
          auVar63._24_4_ = auVar105._24_4_ * 0.0;
          auVar63._28_4_ = auVar105._28_4_;
          auVar94 = vfmsub231ps_fma(auVar63,ZEXT1632(auVar91),auVar104);
          auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),auVar113,ZEXT1632(auVar9));
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar113,ZEXT1632(auVar8));
          auVar99 = ZEXT1632(auVar98);
          uVar78 = vcmpps_avx512vl(auVar104,auVar99,2);
          bVar77 = (byte)uVar78;
          fVar141 = (float)((uint)(bVar77 & 1) * auVar95._0_4_ |
                           (uint)!(bool)(bVar77 & 1) * auVar176._0_4_);
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          fVar143 = (float)((uint)bVar18 * auVar95._4_4_ | (uint)!bVar18 * auVar176._4_4_);
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          fVar146 = (float)((uint)bVar18 * auVar95._8_4_ | (uint)!bVar18 * auVar176._8_4_);
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          fVar147 = (float)((uint)bVar18 * auVar95._12_4_ | (uint)!bVar18 * auVar176._12_4_);
          auVar113 = ZEXT1632(CONCAT412(fVar147,CONCAT48(fVar146,CONCAT44(fVar143,fVar141))));
          fVar142 = (float)((uint)(bVar77 & 1) * auVar153._0_4_ |
                           (uint)!(bool)(bVar77 & 1) * auVar92._0_4_);
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          fVar145 = (float)((uint)bVar18 * auVar153._4_4_ | (uint)!bVar18 * auVar92._4_4_);
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          fVar144 = (float)((uint)bVar18 * auVar153._8_4_ | (uint)!bVar18 * auVar92._8_4_);
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          fVar148 = (float)((uint)bVar18 * auVar153._12_4_ | (uint)!bVar18 * auVar92._12_4_);
          auVar107 = ZEXT1632(CONCAT412(fVar148,CONCAT48(fVar144,CONCAT44(fVar145,fVar142))));
          auVar132._0_4_ =
               (float)((uint)(bVar77 & 1) * auVar115._0_4_ |
                      (uint)!(bool)(bVar77 & 1) * auVar93._0_4_);
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar132._4_4_ = (float)((uint)bVar18 * auVar115._4_4_ | (uint)!bVar18 * auVar93._4_4_);
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar132._8_4_ = (float)((uint)bVar18 * auVar115._8_4_ | (uint)!bVar18 * auVar93._8_4_);
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar132._12_4_ = (float)((uint)bVar18 * auVar115._12_4_ | (uint)!bVar18 * auVar93._12_4_)
          ;
          fVar166 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar115._16_4_);
          auVar132._16_4_ = fVar166;
          fVar149 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar115._20_4_);
          auVar132._20_4_ = fVar149;
          fVar162 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar115._24_4_);
          auVar132._24_4_ = fVar162;
          iVar1 = (uint)(byte)(uVar78 >> 7) * auVar115._28_4_;
          auVar132._28_4_ = iVar1;
          auVar104 = vblendmps_avx512vl(ZEXT1632(auVar91),auVar106);
          auVar133._0_4_ =
               (uint)(bVar77 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar8._0_4_;
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar133._4_4_ = (uint)bVar18 * auVar104._4_4_ | (uint)!bVar18 * auVar8._4_4_;
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar133._8_4_ = (uint)bVar18 * auVar104._8_4_ | (uint)!bVar18 * auVar8._8_4_;
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar133._12_4_ = (uint)bVar18 * auVar104._12_4_ | (uint)!bVar18 * auVar8._12_4_;
          auVar133._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * auVar104._16_4_;
          auVar133._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * auVar104._20_4_;
          auVar133._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * auVar104._24_4_;
          auVar133._28_4_ = (uint)(byte)(uVar78 >> 7) * auVar104._28_4_;
          auVar104 = vblendmps_avx512vl(ZEXT1632(auVar202),ZEXT1632(auVar96));
          auVar134._0_4_ =
               (float)((uint)(bVar77 & 1) * auVar104._0_4_ |
                      (uint)!(bool)(bVar77 & 1) * auVar95._0_4_);
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar134._4_4_ = (float)((uint)bVar18 * auVar104._4_4_ | (uint)!bVar18 * auVar95._4_4_);
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar134._8_4_ = (float)((uint)bVar18 * auVar104._8_4_ | (uint)!bVar18 * auVar95._8_4_);
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar134._12_4_ = (float)((uint)bVar18 * auVar104._12_4_ | (uint)!bVar18 * auVar95._12_4_)
          ;
          fVar163 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar104._16_4_);
          auVar134._16_4_ = fVar163;
          fVar186 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar104._20_4_);
          auVar134._20_4_ = fVar186;
          fVar175 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar104._24_4_);
          auVar134._24_4_ = fVar175;
          auVar134._28_4_ = (uint)(byte)(uVar78 >> 7) * auVar104._28_4_;
          auVar104 = vblendmps_avx512vl(ZEXT1632(auVar29),ZEXT1632(auVar97));
          auVar135._0_4_ =
               (float)((uint)(bVar77 & 1) * auVar104._0_4_ |
                      (uint)!(bool)(bVar77 & 1) * auVar153._0_4_);
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar135._4_4_ = (float)((uint)bVar18 * auVar104._4_4_ | (uint)!bVar18 * auVar153._4_4_);
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar135._8_4_ = (float)((uint)bVar18 * auVar104._8_4_ | (uint)!bVar18 * auVar153._8_4_);
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar135._12_4_ =
               (float)((uint)bVar18 * auVar104._12_4_ | (uint)!bVar18 * auVar153._12_4_);
          fVar90 = (float)((uint)((byte)(uVar78 >> 4) & 1) * auVar104._16_4_);
          auVar135._16_4_ = fVar90;
          fVar174 = (float)((uint)((byte)(uVar78 >> 5) & 1) * auVar104._20_4_);
          auVar135._20_4_ = fVar174;
          fVar89 = (float)((uint)((byte)(uVar78 >> 6) & 1) * auVar104._24_4_);
          auVar135._24_4_ = fVar89;
          iVar2 = (uint)(byte)(uVar78 >> 7) * auVar104._28_4_;
          auVar135._28_4_ = iVar2;
          auVar136._0_4_ =
               (uint)(bVar77 & 1) * (int)auVar91._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar106._0_4_;
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar136._4_4_ = (uint)bVar18 * (int)auVar91._4_4_ | (uint)!bVar18 * auVar106._4_4_;
          bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar136._8_4_ = (uint)bVar18 * (int)auVar91._8_4_ | (uint)!bVar18 * auVar106._8_4_;
          bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar136._12_4_ = (uint)bVar18 * (int)auVar91._12_4_ | (uint)!bVar18 * auVar106._12_4_;
          auVar136._16_4_ = (uint)!(bool)((byte)(uVar78 >> 4) & 1) * auVar106._16_4_;
          auVar136._20_4_ = (uint)!(bool)((byte)(uVar78 >> 5) & 1) * auVar106._20_4_;
          auVar136._24_4_ = (uint)!(bool)((byte)(uVar78 >> 6) & 1) * auVar106._24_4_;
          auVar136._28_4_ = (uint)!SUB81(uVar78 >> 7,0) * auVar106._28_4_;
          bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
          bVar20 = (bool)((byte)(uVar78 >> 2) & 1);
          bVar22 = (bool)((byte)(uVar78 >> 3) & 1);
          bVar19 = (bool)((byte)(uVar78 >> 1) & 1);
          bVar21 = (bool)((byte)(uVar78 >> 2) & 1);
          bVar23 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar106 = vsubps_avx512vl(auVar136,auVar113);
          auVar102 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar202._12_4_ |
                                                   (uint)!bVar22 * auVar96._12_4_,
                                                   CONCAT48((uint)bVar20 * (int)auVar202._8_4_ |
                                                            (uint)!bVar20 * auVar96._8_4_,
                                                            CONCAT44((uint)bVar18 *
                                                                     (int)auVar202._4_4_ |
                                                                     (uint)!bVar18 * auVar96._4_4_,
                                                                     (uint)(bVar77 & 1) *
                                                                     (int)auVar202._0_4_ |
                                                                     (uint)!(bool)(bVar77 & 1) *
                                                                     auVar96._0_4_)))),auVar107);
          auVar197 = ZEXT3264(auVar102);
          auVar115 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar23 * (int)auVar29._12_4_ |
                                                   (uint)!bVar23 * auVar97._12_4_,
                                                   CONCAT48((uint)bVar21 * (int)auVar29._8_4_ |
                                                            (uint)!bVar21 * auVar97._8_4_,
                                                            CONCAT44((uint)bVar19 *
                                                                     (int)auVar29._4_4_ |
                                                                     (uint)!bVar19 * auVar97._4_4_,
                                                                     (uint)(bVar77 & 1) *
                                                                     (int)auVar29._0_4_ |
                                                                     (uint)!(bool)(bVar77 & 1) *
                                                                     auVar97._0_4_)))),auVar132);
          auVar114 = vsubps_avx(auVar113,auVar133);
          auVar201 = ZEXT3264(auVar114);
          auVar105 = vsubps_avx(auVar107,auVar134);
          auVar103 = vsubps_avx(auVar132,auVar135);
          auVar64._4_4_ = auVar115._4_4_ * fVar143;
          auVar64._0_4_ = auVar115._0_4_ * fVar141;
          auVar64._8_4_ = auVar115._8_4_ * fVar146;
          auVar64._12_4_ = auVar115._12_4_ * fVar147;
          auVar64._16_4_ = auVar115._16_4_ * 0.0;
          auVar64._20_4_ = auVar115._20_4_ * 0.0;
          auVar64._24_4_ = auVar115._24_4_ * 0.0;
          auVar64._28_4_ = 0;
          auVar96 = vfmsub231ps_fma(auVar64,auVar132,auVar106);
          auVar184._0_4_ = fVar142 * auVar106._0_4_;
          auVar184._4_4_ = fVar145 * auVar106._4_4_;
          auVar184._8_4_ = fVar144 * auVar106._8_4_;
          auVar184._12_4_ = fVar148 * auVar106._12_4_;
          auVar184._16_4_ = auVar106._16_4_ * 0.0;
          auVar184._20_4_ = auVar106._20_4_ * 0.0;
          auVar184._24_4_ = auVar106._24_4_ * 0.0;
          auVar184._28_4_ = 0;
          auVar97 = vfmsub231ps_fma(auVar184,auVar113,auVar102);
          auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar97),auVar99,ZEXT1632(auVar96));
          auVar190._0_4_ = auVar102._0_4_ * auVar132._0_4_;
          auVar190._4_4_ = auVar102._4_4_ * auVar132._4_4_;
          auVar190._8_4_ = auVar102._8_4_ * auVar132._8_4_;
          auVar190._12_4_ = auVar102._12_4_ * auVar132._12_4_;
          auVar190._16_4_ = auVar102._16_4_ * fVar166;
          auVar190._20_4_ = auVar102._20_4_ * fVar149;
          auVar190._24_4_ = auVar102._24_4_ * fVar162;
          auVar190._28_4_ = 0;
          auVar96 = vfmsub231ps_fma(auVar190,auVar107,auVar115);
          auVar108 = vfmadd231ps_avx512vl(auVar104,auVar99,ZEXT1632(auVar96));
          auVar104 = vmulps_avx512vl(auVar103,auVar133);
          auVar104 = vfmsub231ps_avx512vl(auVar104,auVar114,auVar135);
          auVar65._4_4_ = auVar105._4_4_ * auVar135._4_4_;
          auVar65._0_4_ = auVar105._0_4_ * auVar135._0_4_;
          auVar65._8_4_ = auVar105._8_4_ * auVar135._8_4_;
          auVar65._12_4_ = auVar105._12_4_ * auVar135._12_4_;
          auVar65._16_4_ = auVar105._16_4_ * fVar90;
          auVar65._20_4_ = auVar105._20_4_ * fVar174;
          auVar65._24_4_ = auVar105._24_4_ * fVar89;
          auVar65._28_4_ = iVar2;
          auVar96 = vfmsub231ps_fma(auVar65,auVar134,auVar103);
          auVar191._0_4_ = auVar134._0_4_ * auVar114._0_4_;
          auVar191._4_4_ = auVar134._4_4_ * auVar114._4_4_;
          auVar191._8_4_ = auVar134._8_4_ * auVar114._8_4_;
          auVar191._12_4_ = auVar134._12_4_ * auVar114._12_4_;
          auVar191._16_4_ = fVar163 * auVar114._16_4_;
          auVar191._20_4_ = fVar186 * auVar114._20_4_;
          auVar191._24_4_ = fVar175 * auVar114._24_4_;
          auVar191._28_4_ = 0;
          auVar97 = vfmsub231ps_fma(auVar191,auVar105,auVar133);
          auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar97),auVar99,auVar104);
          auVar110 = vfmadd231ps_avx512vl(auVar104,auVar99,ZEXT1632(auVar96));
          auVar192 = ZEXT3264(auVar110);
          auVar104 = vmaxps_avx(auVar108,auVar110);
          uVar25 = vcmpps_avx512vl(auVar104,auVar99,2);
          bVar87 = bVar87 & (byte)uVar25;
          if (bVar87 != 0) {
            uVar150 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar216._4_4_ = uVar150;
            auVar216._0_4_ = uVar150;
            auVar216._8_4_ = uVar150;
            auVar216._12_4_ = uVar150;
            auVar216._16_4_ = uVar150;
            auVar216._20_4_ = uVar150;
            auVar216._24_4_ = uVar150;
            auVar216._28_4_ = uVar150;
            auVar217 = ZEXT3264(auVar216);
            auVar66._4_4_ = auVar103._4_4_ * auVar102._4_4_;
            auVar66._0_4_ = auVar103._0_4_ * auVar102._0_4_;
            auVar66._8_4_ = auVar103._8_4_ * auVar102._8_4_;
            auVar66._12_4_ = auVar103._12_4_ * auVar102._12_4_;
            auVar66._16_4_ = auVar103._16_4_ * auVar102._16_4_;
            auVar66._20_4_ = auVar103._20_4_ * auVar102._20_4_;
            auVar66._24_4_ = auVar103._24_4_ * auVar102._24_4_;
            auVar66._28_4_ = auVar104._28_4_;
            auVar9 = vfmsub231ps_fma(auVar66,auVar105,auVar115);
            auVar67._4_4_ = auVar115._4_4_ * auVar114._4_4_;
            auVar67._0_4_ = auVar115._0_4_ * auVar114._0_4_;
            auVar67._8_4_ = auVar115._8_4_ * auVar114._8_4_;
            auVar67._12_4_ = auVar115._12_4_ * auVar114._12_4_;
            auVar67._16_4_ = auVar115._16_4_ * auVar114._16_4_;
            auVar67._20_4_ = auVar115._20_4_ * auVar114._20_4_;
            auVar67._24_4_ = auVar115._24_4_ * auVar114._24_4_;
            auVar67._28_4_ = auVar115._28_4_;
            auVar8 = vfmsub231ps_fma(auVar67,auVar106,auVar103);
            auVar68._4_4_ = auVar105._4_4_ * auVar106._4_4_;
            auVar68._0_4_ = auVar105._0_4_ * auVar106._0_4_;
            auVar68._8_4_ = auVar105._8_4_ * auVar106._8_4_;
            auVar68._12_4_ = auVar105._12_4_ * auVar106._12_4_;
            auVar68._16_4_ = auVar105._16_4_ * auVar106._16_4_;
            auVar68._20_4_ = auVar105._20_4_ * auVar106._20_4_;
            auVar68._24_4_ = auVar105._24_4_ * auVar106._24_4_;
            auVar68._28_4_ = auVar105._28_4_;
            auVar95 = vfmsub231ps_fma(auVar68,auVar114,auVar102);
            auVar96 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar8),ZEXT1632(auVar95));
            auVar97 = vfmadd231ps_fma(ZEXT1632(auVar96),ZEXT1632(auVar9),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar104 = vrcp14ps_avx512vl(ZEXT1632(auVar97));
            auVar201 = ZEXT3264(auVar104);
            auVar34._8_4_ = 0x3f800000;
            auVar34._0_8_ = 0x3f8000003f800000;
            auVar34._12_4_ = 0x3f800000;
            auVar34._16_4_ = 0x3f800000;
            auVar34._20_4_ = 0x3f800000;
            auVar34._24_4_ = 0x3f800000;
            auVar34._28_4_ = 0x3f800000;
            auVar102 = vfnmadd213ps_avx512vl(auVar104,ZEXT1632(auVar97),auVar34);
            auVar96 = vfmadd132ps_fma(auVar102,auVar104,auVar104);
            auVar197 = ZEXT1664(auVar96);
            auVar69._4_4_ = auVar95._4_4_ * auVar132._4_4_;
            auVar69._0_4_ = auVar95._0_4_ * auVar132._0_4_;
            auVar69._8_4_ = auVar95._8_4_ * auVar132._8_4_;
            auVar69._12_4_ = auVar95._12_4_ * auVar132._12_4_;
            auVar69._16_4_ = fVar166 * 0.0;
            auVar69._20_4_ = fVar149 * 0.0;
            auVar69._24_4_ = fVar162 * 0.0;
            auVar69._28_4_ = iVar1;
            auVar8 = vfmadd231ps_fma(auVar69,auVar107,ZEXT1632(auVar8));
            auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar113,ZEXT1632(auVar9));
            fVar166 = auVar96._0_4_;
            fVar149 = auVar96._4_4_;
            fVar162 = auVar96._8_4_;
            fVar163 = auVar96._12_4_;
            local_220 = ZEXT1632(CONCAT412(auVar8._12_4_ * fVar163,
                                           CONCAT48(auVar8._8_4_ * fVar162,
                                                    CONCAT44(auVar8._4_4_ * fVar149,
                                                             auVar8._0_4_ * fVar166))));
            auVar203 = ZEXT3264(local_220);
            uVar25 = vcmpps_avx512vl(local_220,auVar216,2);
            auVar76._4_4_ = uStack_41c;
            auVar76._0_4_ = local_420;
            auVar76._8_4_ = uStack_418;
            auVar76._12_4_ = uStack_414;
            auVar76._16_4_ = uStack_410;
            auVar76._20_4_ = uStack_40c;
            auVar76._24_4_ = uStack_408;
            auVar76._28_4_ = uStack_404;
            uVar26 = vcmpps_avx512vl(local_220,auVar76,0xd);
            bVar87 = (byte)uVar25 & (byte)uVar26 & bVar87;
            if (bVar87 != 0) {
              uVar84 = vcmpps_avx512vl(ZEXT1632(auVar97),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar84 = bVar87 & uVar84;
              if ((char)uVar84 != '\0') {
                fVar175 = auVar108._0_4_ * fVar166;
                fVar186 = auVar108._4_4_ * fVar149;
                auVar70._4_4_ = fVar186;
                auVar70._0_4_ = fVar175;
                fVar89 = auVar108._8_4_ * fVar162;
                auVar70._8_4_ = fVar89;
                fVar90 = auVar108._12_4_ * fVar163;
                auVar70._12_4_ = fVar90;
                fVar174 = auVar108._16_4_ * 0.0;
                auVar70._16_4_ = fVar174;
                fVar141 = auVar108._20_4_ * 0.0;
                auVar70._20_4_ = fVar141;
                fVar142 = auVar108._24_4_ * 0.0;
                auVar70._24_4_ = fVar142;
                auVar70._28_4_ = auVar108._28_4_;
                auVar173._8_4_ = 0x3f800000;
                auVar173._0_8_ = 0x3f8000003f800000;
                auVar173._12_4_ = 0x3f800000;
                auVar173._16_4_ = 0x3f800000;
                auVar173._20_4_ = 0x3f800000;
                auVar173._24_4_ = 0x3f800000;
                auVar173._28_4_ = 0x3f800000;
                auVar104 = vsubps_avx(auVar173,auVar70);
                local_260._0_4_ =
                     (float)((uint)(bVar77 & 1) * (int)fVar175 |
                            (uint)!(bool)(bVar77 & 1) * auVar104._0_4_);
                bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
                local_260._4_4_ =
                     (float)((uint)bVar18 * (int)fVar186 | (uint)!bVar18 * auVar104._4_4_);
                bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
                local_260._8_4_ =
                     (float)((uint)bVar18 * (int)fVar89 | (uint)!bVar18 * auVar104._8_4_);
                bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
                local_260._12_4_ =
                     (float)((uint)bVar18 * (int)fVar90 | (uint)!bVar18 * auVar104._12_4_);
                bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
                local_260._16_4_ =
                     (float)((uint)bVar18 * (int)fVar174 | (uint)!bVar18 * auVar104._16_4_);
                bVar18 = (bool)((byte)(uVar78 >> 5) & 1);
                local_260._20_4_ =
                     (float)((uint)bVar18 * (int)fVar141 | (uint)!bVar18 * auVar104._20_4_);
                bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
                local_260._24_4_ =
                     (float)((uint)bVar18 * (int)fVar142 | (uint)!bVar18 * auVar104._24_4_);
                bVar18 = SUB81(uVar78 >> 7,0);
                local_260._28_4_ =
                     (float)((uint)bVar18 * auVar108._28_4_ | (uint)!bVar18 * auVar104._28_4_);
                auVar104 = vsubps_avx(auVar109,auVar101);
                auVar96 = vfmadd213ps_fma(auVar104,local_260,auVar101);
                uVar150 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
                auVar35._4_4_ = uVar150;
                auVar35._0_4_ = uVar150;
                auVar35._8_4_ = uVar150;
                auVar35._12_4_ = uVar150;
                auVar35._16_4_ = uVar150;
                auVar35._20_4_ = uVar150;
                auVar35._24_4_ = uVar150;
                auVar35._28_4_ = uVar150;
                auVar104 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar96._12_4_ + auVar96._12_4_,
                                                              CONCAT48(auVar96._8_4_ + auVar96._8_4_
                                                                       ,CONCAT44(auVar96._4_4_ +
                                                                                 auVar96._4_4_,
                                                                                 auVar96._0_4_ +
                                                                                 auVar96._0_4_)))),
                                           auVar35);
                uVar88 = vcmpps_avx512vl(local_220,auVar104,6);
                uVar84 = uVar84 & uVar88;
                bVar87 = (byte)uVar84;
                if (bVar87 != 0) {
                  auVar165._0_4_ = auVar110._0_4_ * fVar166;
                  auVar165._4_4_ = auVar110._4_4_ * fVar149;
                  auVar165._8_4_ = auVar110._8_4_ * fVar162;
                  auVar165._12_4_ = auVar110._12_4_ * fVar163;
                  auVar165._16_4_ = auVar110._16_4_ * 0.0;
                  auVar165._20_4_ = auVar110._20_4_ * 0.0;
                  auVar165._24_4_ = auVar110._24_4_ * 0.0;
                  auVar165._28_4_ = 0;
                  auVar185._8_4_ = 0x3f800000;
                  auVar185._0_8_ = 0x3f8000003f800000;
                  auVar185._12_4_ = 0x3f800000;
                  auVar185._16_4_ = 0x3f800000;
                  auVar185._20_4_ = 0x3f800000;
                  auVar185._24_4_ = 0x3f800000;
                  auVar185._28_4_ = 0x3f800000;
                  auVar104 = vsubps_avx(auVar185,auVar165);
                  auVar137._0_4_ =
                       (uint)(bVar77 & 1) * (int)auVar165._0_4_ |
                       (uint)!(bool)(bVar77 & 1) * auVar104._0_4_;
                  bVar18 = (bool)((byte)(uVar78 >> 1) & 1);
                  auVar137._4_4_ =
                       (uint)bVar18 * (int)auVar165._4_4_ | (uint)!bVar18 * auVar104._4_4_;
                  bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
                  auVar137._8_4_ =
                       (uint)bVar18 * (int)auVar165._8_4_ | (uint)!bVar18 * auVar104._8_4_;
                  bVar18 = (bool)((byte)(uVar78 >> 3) & 1);
                  auVar137._12_4_ =
                       (uint)bVar18 * (int)auVar165._12_4_ | (uint)!bVar18 * auVar104._12_4_;
                  bVar18 = (bool)((byte)(uVar78 >> 4) & 1);
                  auVar137._16_4_ =
                       (uint)bVar18 * (int)auVar165._16_4_ | (uint)!bVar18 * auVar104._16_4_;
                  bVar18 = (bool)((byte)(uVar78 >> 5) & 1);
                  auVar137._20_4_ =
                       (uint)bVar18 * (int)auVar165._20_4_ | (uint)!bVar18 * auVar104._20_4_;
                  bVar18 = (bool)((byte)(uVar78 >> 6) & 1);
                  auVar137._24_4_ =
                       (uint)bVar18 * (int)auVar165._24_4_ | (uint)!bVar18 * auVar104._24_4_;
                  auVar137._28_4_ = (uint)!SUB81(uVar78 >> 7,0) * auVar104._28_4_;
                  auVar36._8_4_ = 0x40000000;
                  auVar36._0_8_ = 0x4000000040000000;
                  auVar36._12_4_ = 0x40000000;
                  auVar36._16_4_ = 0x40000000;
                  auVar36._20_4_ = 0x40000000;
                  auVar36._24_4_ = 0x40000000;
                  auVar36._28_4_ = 0x40000000;
                  local_240 = vfmsub132ps_avx512vl(auVar137,auVar185,auVar36);
                  local_200 = (int)lVar81;
                  local_1fc = iVar83;
                  auVar201 = ZEXT1664(local_5b0);
                  local_1f0 = local_5b0;
                  local_1e0 = uVar24;
                  uStack_1d8 = uVar27;
                  local_1d0 = uVar72;
                  uStack_1c8 = uVar73;
                  local_1c0 = uVar74;
                  uStack_1b8 = uVar75;
                  pGVar82 = (context->scene->geometries).items[uVar85].ptr;
                  if ((pGVar82->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    auVar96 = vcvtsi2ss_avx512f(auVar98,(int)lVar81);
                    fVar166 = auVar96._0_4_;
                    local_1a0[0] = (fVar166 + local_260._0_4_ + 0.0) * (float)local_4c0;
                    local_1a0[1] = (fVar166 + local_260._4_4_ + 1.0) * local_4c0._4_4_;
                    local_1a0[2] = (fVar166 + local_260._8_4_ + 2.0) * fStack_4b8;
                    local_1a0[3] = (fVar166 + local_260._12_4_ + 3.0) * fStack_4b4;
                    fStack_190 = (fVar166 + local_260._16_4_ + 4.0) * fStack_4b0;
                    fStack_18c = (fVar166 + local_260._20_4_ + 5.0) * fStack_4ac;
                    fStack_188 = (fVar166 + local_260._24_4_ + 6.0) * fStack_4a8;
                    fStack_184 = fVar166 + local_260._28_4_ + 7.0;
                    local_180 = local_240;
                    local_160 = local_220;
                    auVar157._8_4_ = 0x7f800000;
                    auVar157._0_8_ = 0x7f8000007f800000;
                    auVar157._12_4_ = 0x7f800000;
                    auVar157._16_4_ = 0x7f800000;
                    auVar157._20_4_ = 0x7f800000;
                    auVar157._24_4_ = 0x7f800000;
                    auVar157._28_4_ = 0x7f800000;
                    auVar104 = vblendmps_avx512vl(auVar157,local_220);
                    auVar138._0_4_ =
                         (uint)(bVar87 & 1) * auVar104._0_4_ |
                         (uint)!(bool)(bVar87 & 1) * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar84 >> 1) & 1);
                    auVar138._4_4_ = (uint)bVar18 * auVar104._4_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar84 >> 2) & 1);
                    auVar138._8_4_ = (uint)bVar18 * auVar104._8_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar84 >> 3) & 1);
                    auVar138._12_4_ = (uint)bVar18 * auVar104._12_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar84 >> 4) & 1);
                    auVar138._16_4_ = (uint)bVar18 * auVar104._16_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar84 >> 5) & 1);
                    auVar138._20_4_ = (uint)bVar18 * auVar104._20_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar84 >> 6) & 1);
                    auVar138._24_4_ = (uint)bVar18 * auVar104._24_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = SUB81(uVar84 >> 7,0);
                    auVar138._28_4_ = (uint)bVar18 * auVar104._28_4_ | (uint)!bVar18 * 0x7f800000;
                    auVar104 = vshufps_avx(auVar138,auVar138,0xb1);
                    auVar104 = vminps_avx(auVar138,auVar104);
                    auVar102 = vshufpd_avx(auVar104,auVar104,5);
                    auVar104 = vminps_avx(auVar104,auVar102);
                    auVar102 = vpermpd_avx2(auVar104,0x4e);
                    auVar104 = vminps_avx(auVar104,auVar102);
                    uVar25 = vcmpps_avx512vl(auVar138,auVar104,0);
                    uVar79 = (uint)uVar84;
                    if (((byte)uVar25 & bVar87) != 0) {
                      uVar79 = (uint)((byte)uVar25 & bVar87);
                    }
                    uVar80 = 0;
                    for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
                      uVar80 = uVar80 + 1;
                    }
                    uVar78 = (ulong)uVar80;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar82->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_120 = vmovdqa64_avx512vl(auVar219._0_32_);
                      local_4e0._0_4_ = iVar83;
                      local_548 = uVar86;
                      local_460 = local_220;
                      do {
                        local_3c0 = local_1a0[uVar78];
                        local_3b0 = *(undefined4 *)(local_180 + uVar78 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_160 + uVar78 * 4);
                        local_5a0.context = context->user;
                        fVar149 = 1.0 - local_3c0;
                        fVar166 = fVar149 * fVar149 * -3.0;
                        auVar96 = vfmadd231ss_fma(ZEXT416((uint)(fVar149 * fVar149)),
                                                  ZEXT416((uint)(local_3c0 * fVar149)),
                                                  ZEXT416(0xc0000000));
                        auVar97 = vfmsub132ss_fma(ZEXT416((uint)(local_3c0 * fVar149)),
                                                  ZEXT416((uint)(local_3c0 * local_3c0)),
                                                  ZEXT416(0x40000000));
                        fVar149 = auVar96._0_4_ * 3.0;
                        fVar162 = auVar97._0_4_ * 3.0;
                        fVar163 = local_3c0 * local_3c0 * 3.0;
                        auVar195._0_4_ = fVar163 * local_5f0;
                        auVar195._4_4_ = fVar163 * fStack_5ec;
                        auVar195._8_4_ = fVar163 * fStack_5e8;
                        auVar195._12_4_ = fVar163 * fStack_5e4;
                        auVar197 = ZEXT1664(auVar195);
                        auVar151._4_4_ = fVar162;
                        auVar151._0_4_ = fVar162;
                        auVar151._8_4_ = fVar162;
                        auVar151._12_4_ = fVar162;
                        auVar96 = vfmadd132ps_fma(auVar151,auVar195,auVar12);
                        auVar180._4_4_ = fVar149;
                        auVar180._0_4_ = fVar149;
                        auVar180._8_4_ = fVar149;
                        auVar180._12_4_ = fVar149;
                        auVar96 = vfmadd132ps_fma(auVar180,auVar96,auVar13);
                        auVar152._4_4_ = fVar166;
                        auVar152._0_4_ = fVar166;
                        auVar152._8_4_ = fVar166;
                        auVar152._12_4_ = fVar166;
                        auVar96 = vfmadd213ps_fma(auVar152,auVar201._0_16_,auVar96);
                        local_3f0 = auVar96._0_4_;
                        local_3e0 = vshufps_avx(auVar96,auVar96,0x55);
                        auVar192 = ZEXT1664(local_3e0);
                        local_3d0 = vshufps_avx(auVar96,auVar96,0xaa);
                        iStack_3ec = local_3f0;
                        iStack_3e8 = local_3f0;
                        iStack_3e4 = local_3f0;
                        fStack_3bc = local_3c0;
                        fStack_3b8 = local_3c0;
                        fStack_3b4 = local_3c0;
                        uStack_3ac = local_3b0;
                        uStack_3a8 = local_3b0;
                        uStack_3a4 = local_3b0;
                        local_3a0 = local_560._0_8_;
                        uStack_398 = local_560._8_8_;
                        local_390 = local_570;
                        vpcmpeqd_avx2(ZEXT1632(local_570),ZEXT1632(local_570));
                        uStack_37c = (local_5a0.context)->instID[0];
                        local_380 = uStack_37c;
                        uStack_378 = uStack_37c;
                        uStack_374 = uStack_37c;
                        uStack_370 = (local_5a0.context)->instPrimID[0];
                        uStack_36c = uStack_370;
                        uStack_368 = uStack_370;
                        uStack_364 = uStack_370;
                        local_5c0 = local_4f0;
                        local_5a0.valid = (int *)local_5c0;
                        local_5a0.geometryUserPtr = pGVar82->userPtr;
                        local_5a0.hit = (RTCHitN *)&local_3f0;
                        local_5a0.N = 4;
                        local_520 = auVar217._0_32_;
                        local_5a0.ray = (RTCRayN *)ray;
                        if (pGVar82->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar192 = ZEXT1664(local_3e0);
                          auVar197 = ZEXT1664(auVar195);
                          (*pGVar82->intersectionFilterN)(&local_5a0);
                          auVar203 = ZEXT3264(local_460);
                          auVar217 = ZEXT3264(local_520);
                          auVar201 = ZEXT1664(local_5b0);
                        }
                        uVar86 = vptestmd_avx512vl(local_5c0,local_5c0);
                        if ((uVar86 & 0xf) == 0) {
LAB_01d5b0ce:
                          *(int *)(ray + k * 4 + 0x80) = auVar217._0_4_;
                        }
                        else {
                          p_Var17 = context->args->filter;
                          if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar82->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar192 = ZEXT1664(auVar192._0_16_);
                            auVar197 = ZEXT1664(auVar197._0_16_);
                            (*p_Var17)(&local_5a0);
                            auVar203 = ZEXT3264(local_460);
                            auVar217 = ZEXT3264(local_520);
                            auVar201 = ZEXT1664(local_5b0);
                          }
                          uVar86 = vptestmd_avx512vl(local_5c0,local_5c0);
                          uVar86 = uVar86 & 0xf;
                          bVar87 = (byte)uVar86;
                          if (bVar87 == 0) goto LAB_01d5b0ce;
                          iVar83 = *(int *)(local_5a0.hit + 4);
                          iVar1 = *(int *)(local_5a0.hit + 8);
                          iVar2 = *(int *)(local_5a0.hit + 0xc);
                          bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar86 >> 2) & 1);
                          bVar20 = SUB81(uVar86 >> 3,0);
                          *(uint *)(local_5a0.ray + 0xc0) =
                               (uint)(bVar87 & 1) * *(int *)local_5a0.hit |
                               (uint)!(bool)(bVar87 & 1) * *(int *)(local_5a0.ray + 0xc0);
                          *(uint *)(local_5a0.ray + 0xc4) =
                               (uint)bVar18 * iVar83 |
                               (uint)!bVar18 * *(int *)(local_5a0.ray + 0xc4);
                          *(uint *)(local_5a0.ray + 200) =
                               (uint)bVar19 * iVar1 | (uint)!bVar19 * *(int *)(local_5a0.ray + 200);
                          *(uint *)(local_5a0.ray + 0xcc) =
                               (uint)bVar20 * iVar2 | (uint)!bVar20 * *(int *)(local_5a0.ray + 0xcc)
                          ;
                          iVar83 = *(int *)(local_5a0.hit + 0x14);
                          iVar1 = *(int *)(local_5a0.hit + 0x18);
                          iVar2 = *(int *)(local_5a0.hit + 0x1c);
                          bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar86 >> 2) & 1);
                          bVar20 = SUB81(uVar86 >> 3,0);
                          *(uint *)(local_5a0.ray + 0xd0) =
                               (uint)(bVar87 & 1) * *(int *)(local_5a0.hit + 0x10) |
                               (uint)!(bool)(bVar87 & 1) * *(int *)(local_5a0.ray + 0xd0);
                          *(uint *)(local_5a0.ray + 0xd4) =
                               (uint)bVar18 * iVar83 |
                               (uint)!bVar18 * *(int *)(local_5a0.ray + 0xd4);
                          *(uint *)(local_5a0.ray + 0xd8) =
                               (uint)bVar19 * iVar1 | (uint)!bVar19 * *(int *)(local_5a0.ray + 0xd8)
                          ;
                          *(uint *)(local_5a0.ray + 0xdc) =
                               (uint)bVar20 * iVar2 | (uint)!bVar20 * *(int *)(local_5a0.ray + 0xdc)
                          ;
                          iVar83 = *(int *)(local_5a0.hit + 0x24);
                          iVar1 = *(int *)(local_5a0.hit + 0x28);
                          iVar2 = *(int *)(local_5a0.hit + 0x2c);
                          bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar86 >> 2) & 1);
                          bVar20 = SUB81(uVar86 >> 3,0);
                          *(uint *)(local_5a0.ray + 0xe0) =
                               (uint)(bVar87 & 1) * *(int *)(local_5a0.hit + 0x20) |
                               (uint)!(bool)(bVar87 & 1) * *(int *)(local_5a0.ray + 0xe0);
                          *(uint *)(local_5a0.ray + 0xe4) =
                               (uint)bVar18 * iVar83 |
                               (uint)!bVar18 * *(int *)(local_5a0.ray + 0xe4);
                          *(uint *)(local_5a0.ray + 0xe8) =
                               (uint)bVar19 * iVar1 | (uint)!bVar19 * *(int *)(local_5a0.ray + 0xe8)
                          ;
                          *(uint *)(local_5a0.ray + 0xec) =
                               (uint)bVar20 * iVar2 | (uint)!bVar20 * *(int *)(local_5a0.ray + 0xec)
                          ;
                          iVar83 = *(int *)(local_5a0.hit + 0x34);
                          iVar1 = *(int *)(local_5a0.hit + 0x38);
                          iVar2 = *(int *)(local_5a0.hit + 0x3c);
                          bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar86 >> 2) & 1);
                          bVar20 = SUB81(uVar86 >> 3,0);
                          *(uint *)(local_5a0.ray + 0xf0) =
                               (uint)(bVar87 & 1) * *(int *)(local_5a0.hit + 0x30) |
                               (uint)!(bool)(bVar87 & 1) * *(int *)(local_5a0.ray + 0xf0);
                          *(uint *)(local_5a0.ray + 0xf4) =
                               (uint)bVar18 * iVar83 |
                               (uint)!bVar18 * *(int *)(local_5a0.ray + 0xf4);
                          *(uint *)(local_5a0.ray + 0xf8) =
                               (uint)bVar19 * iVar1 | (uint)!bVar19 * *(int *)(local_5a0.ray + 0xf8)
                          ;
                          *(uint *)(local_5a0.ray + 0xfc) =
                               (uint)bVar20 * iVar2 | (uint)!bVar20 * *(int *)(local_5a0.ray + 0xfc)
                          ;
                          iVar83 = *(int *)(local_5a0.hit + 0x44);
                          iVar1 = *(int *)(local_5a0.hit + 0x48);
                          iVar2 = *(int *)(local_5a0.hit + 0x4c);
                          bVar18 = (bool)((byte)(uVar86 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar86 >> 2) & 1);
                          bVar20 = SUB81(uVar86 >> 3,0);
                          *(uint *)(local_5a0.ray + 0x100) =
                               (uint)(bVar87 & 1) * *(int *)(local_5a0.hit + 0x40) |
                               (uint)!(bool)(bVar87 & 1) * *(int *)(local_5a0.ray + 0x100);
                          *(uint *)(local_5a0.ray + 0x104) =
                               (uint)bVar18 * iVar83 |
                               (uint)!bVar18 * *(int *)(local_5a0.ray + 0x104);
                          *(uint *)(local_5a0.ray + 0x108) =
                               (uint)bVar19 * iVar1 |
                               (uint)!bVar19 * *(int *)(local_5a0.ray + 0x108);
                          *(uint *)(local_5a0.ray + 0x10c) =
                               (uint)bVar20 * iVar2 |
                               (uint)!bVar20 * *(int *)(local_5a0.ray + 0x10c);
                          auVar96 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x50))
                          ;
                          *(undefined1 (*) [16])(local_5a0.ray + 0x110) = auVar96;
                          auVar96 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x60))
                          ;
                          *(undefined1 (*) [16])(local_5a0.ray + 0x120) = auVar96;
                          auVar96 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x70))
                          ;
                          *(undefined1 (*) [16])(local_5a0.ray + 0x130) = auVar96;
                          auVar96 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x80))
                          ;
                          *(undefined1 (*) [16])(local_5a0.ray + 0x140) = auVar96;
                          auVar217 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                        }
                        bVar87 = ~(byte)(1 << ((uint)uVar78 & 0x1f)) & (byte)uVar84;
                        uVar150 = auVar217._0_4_;
                        auVar158._4_4_ = uVar150;
                        auVar158._0_4_ = uVar150;
                        auVar158._8_4_ = uVar150;
                        auVar158._12_4_ = uVar150;
                        auVar158._16_4_ = uVar150;
                        auVar158._20_4_ = uVar150;
                        auVar158._24_4_ = uVar150;
                        auVar158._28_4_ = uVar150;
                        uVar25 = vcmpps_avx512vl(auVar203._0_32_,auVar158,2);
                        if ((bVar87 & (byte)uVar25) == 0) goto LAB_01d5b162;
                        bVar87 = bVar87 & (byte)uVar25;
                        uVar84 = (ulong)bVar87;
                        auVar159._8_4_ = 0x7f800000;
                        auVar159._0_8_ = 0x7f8000007f800000;
                        auVar159._12_4_ = 0x7f800000;
                        auVar159._16_4_ = 0x7f800000;
                        auVar159._20_4_ = 0x7f800000;
                        auVar159._24_4_ = 0x7f800000;
                        auVar159._28_4_ = 0x7f800000;
                        auVar104 = vblendmps_avx512vl(auVar159,auVar203._0_32_);
                        auVar139._0_4_ =
                             (uint)(bVar87 & 1) * auVar104._0_4_ |
                             (uint)!(bool)(bVar87 & 1) * 0x7f800000;
                        bVar18 = (bool)(bVar87 >> 1 & 1);
                        auVar139._4_4_ = (uint)bVar18 * auVar104._4_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar87 >> 2 & 1);
                        auVar139._8_4_ = (uint)bVar18 * auVar104._8_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar87 >> 3 & 1);
                        auVar139._12_4_ =
                             (uint)bVar18 * auVar104._12_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar87 >> 4 & 1);
                        auVar139._16_4_ =
                             (uint)bVar18 * auVar104._16_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar87 >> 5 & 1);
                        auVar139._20_4_ =
                             (uint)bVar18 * auVar104._20_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar87 >> 6 & 1);
                        auVar139._24_4_ =
                             (uint)bVar18 * auVar104._24_4_ | (uint)!bVar18 * 0x7f800000;
                        auVar139._28_4_ =
                             (uint)(bVar87 >> 7) * auVar104._28_4_ |
                             (uint)!(bool)(bVar87 >> 7) * 0x7f800000;
                        auVar104 = vshufps_avx(auVar139,auVar139,0xb1);
                        auVar104 = vminps_avx(auVar139,auVar104);
                        auVar102 = vshufpd_avx(auVar104,auVar104,5);
                        auVar104 = vminps_avx(auVar104,auVar102);
                        auVar102 = vpermpd_avx2(auVar104,0x4e);
                        auVar104 = vminps_avx(auVar104,auVar102);
                        uVar25 = vcmpps_avx512vl(auVar139,auVar104,0);
                        bVar77 = (byte)uVar25 & bVar87;
                        if (bVar77 != 0) {
                          bVar87 = bVar77;
                        }
                        uVar79 = 0;
                        for (uVar80 = (uint)bVar87; (uVar80 & 1) == 0;
                            uVar80 = uVar80 >> 1 | 0x80000000) {
                          uVar79 = uVar79 + 1;
                        }
                        uVar78 = (ulong)uVar79;
                      } while( true );
                    }
                    fVar166 = local_1a0[uVar78];
                    uVar150 = *(undefined4 *)(local_180 + uVar78 * 4);
                    fVar162 = 1.0 - fVar166;
                    fVar149 = fVar162 * fVar162 * -3.0;
                    auVar192 = ZEXT464((uint)fVar149);
                    auVar96 = vfmadd231ss_fma(ZEXT416((uint)(fVar162 * fVar162)),
                                              ZEXT416((uint)(fVar166 * fVar162)),ZEXT416(0xc0000000)
                                             );
                    auVar97 = vfmsub132ss_fma(ZEXT416((uint)(fVar166 * fVar162)),
                                              ZEXT416((uint)(fVar166 * fVar166)),ZEXT416(0x40000000)
                                             );
                    fVar162 = auVar96._0_4_ * 3.0;
                    fVar163 = auVar97._0_4_ * 3.0;
                    fVar175 = fVar166 * fVar166 * 3.0;
                    auVar194._0_4_ = fVar175 * local_5f0;
                    auVar194._4_4_ = fVar175 * fStack_5ec;
                    auVar194._8_4_ = fVar175 * fStack_5e8;
                    auVar194._12_4_ = fVar175 * fStack_5e4;
                    auVar197 = ZEXT1664(auVar194);
                    auVar169._4_4_ = fVar163;
                    auVar169._0_4_ = fVar163;
                    auVar169._8_4_ = fVar163;
                    auVar169._12_4_ = fVar163;
                    auVar96 = vfmadd132ps_fma(auVar169,auVar194,auVar10);
                    auVar179._4_4_ = fVar162;
                    auVar179._0_4_ = fVar162;
                    auVar179._8_4_ = fVar162;
                    auVar179._12_4_ = fVar162;
                    auVar96 = vfmadd132ps_fma(auVar179,auVar96,auVar11);
                    auVar170._4_4_ = fVar149;
                    auVar170._0_4_ = fVar149;
                    auVar170._8_4_ = fVar149;
                    auVar170._12_4_ = fVar149;
                    auVar96 = vfmadd213ps_fma(auVar170,local_5b0,auVar96);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar78 * 4);
                    *(int *)(ray + k * 4 + 0xc0) = auVar96._0_4_;
                    uVar16 = vextractps_avx(auVar96,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar16;
                    uVar16 = vextractps_avx(auVar96,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar16;
                    *(float *)(ray + k * 4 + 0xf0) = fVar166;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar150;
                    *(uint *)(ray + k * 4 + 0x110) = uVar15;
                    *(uint *)(ray + k * 4 + 0x120) = uVar85;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01d5adac;
      }
LAB_01d5a453:
      uVar150 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar33._4_4_ = uVar150;
      auVar33._0_4_ = uVar150;
      auVar33._8_4_ = uVar150;
      auVar33._12_4_ = uVar150;
      auVar33._16_4_ = uVar150;
      auVar33._20_4_ = uVar150;
      auVar33._24_4_ = uVar150;
      auVar33._28_4_ = uVar150;
      uVar24 = vcmpps_avx512vl(local_80,auVar33,2);
      uVar85 = (uint)uVar86 & (uint)uVar24;
      uVar86 = (ulong)uVar85;
    } while (uVar85 != 0);
  }
  return;
LAB_01d5b162:
  auVar218 = ZEXT3264(local_480);
  auVar220 = ZEXT3264(local_4a0);
  auVar104 = vmovdqa64_avx512vl(local_120);
  auVar219 = ZEXT3264(auVar104);
  uVar86 = local_548;
  iVar83 = local_4e0._0_4_;
LAB_01d5adac:
  lVar81 = lVar81 + 8;
  if (iVar83 <= (int)lVar81) goto LAB_01d5a453;
  goto LAB_01d5a4f7;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }